

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ImWchar IVar9;
  ushort uVar10;
  undefined2 uVar11;
  int iVar12;
  ImFont *pIVar13;
  ImFontConfig *pIVar14;
  undefined8 *puVar15;
  char cVar16;
  char cVar24;
  undefined1 auVar32 [16];
  stbtt__buf fontdict;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [14];
  undefined1 auVar36 [16];
  stbtt__active_edge **ppsVar37;
  ushort uVar38;
  short sVar39;
  short sVar40;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  void *p;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  void *pvVar52;
  int *piVar53;
  void *pvVar54;
  stbrp_context *ptr;
  uchar *puVar55;
  void *pvVar56;
  long lVar57;
  stbtt__edge *psVar58;
  stbtt__buf *scanline;
  stbtt__buf *psVar59;
  stbtt__active_edge *psVar60;
  undefined8 *puVar61;
  stbtt__active_edge *psVar62;
  bool bVar63;
  stbtt__active_edge *z_1;
  ImWchar *pIVar64;
  ushort *puVar65;
  long lVar66;
  stbtt__active_edge *psVar67;
  int x;
  ImFontConfig *pIVar68;
  int iVar69;
  ulong uVar70;
  bool bVar71;
  ImU32 bit_n;
  uint uVar72;
  uint uVar73;
  long lVar74;
  uchar uVar75;
  void *pvVar76;
  ulong uVar77;
  uint *puVar78;
  stbrp_node **ppsVar79;
  ulong uVar80;
  byte *pbVar81;
  ulong uVar82;
  stbtt__edge *psVar83;
  long lVar84;
  ImFontConfig *pIVar85;
  ulong uVar86;
  byte *pbVar87;
  ImU32 mask;
  uint uVar88;
  stbtt_fontinfo *psVar89;
  bool bVar90;
  short sVar96;
  short sVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar113;
  float fVar114;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar122;
  uint uVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar124;
  uint uVar125;
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar127;
  undefined4 uVar128;
  uint uVar135;
  float fVar136;
  uint uVar137;
  float fVar138;
  uint uVar139;
  float fVar140;
  undefined1 auVar133 [16];
  float fVar141;
  uint uVar146;
  uint uVar148;
  undefined1 auVar142 [16];
  float fVar147;
  float fVar149;
  uint uVar150;
  float fVar151;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined4 uVar152;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  stbtt__buf sVar167;
  ImU32 *it_end;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  int y0_1;
  int x0_1;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2c [12];
  undefined4 uVar168;
  int in_stack_fffffffffffffb5c;
  undefined4 uVar169;
  undefined1 local_488 [16];
  stbtt_uint32 local_46c;
  stbtt__active_edge local_468;
  undefined1 local_448 [16];
  stbrp_node *local_430;
  undefined1 local_428 [16];
  undefined8 local_410;
  float local_404;
  uint local_400;
  int local_3fc;
  float local_3f8;
  int local_3f4;
  stbtt__edge *local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  undefined1 local_3d8 [8];
  void *pvStack_3d0;
  long local_3c8;
  void *pvStack_3c0;
  ulong local_3b8;
  stbtt__active_edge *local_3b0;
  void *local_3a8;
  float local_39c;
  float local_398;
  float local_394;
  int local_390;
  int local_38c;
  undefined8 local_388;
  void *pvStack_380;
  undefined8 *local_370;
  ImFontConfig *local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined8 local_358;
  void *pvStack_350;
  uchar *local_348;
  ulong local_340;
  ulong local_338;
  long local_330;
  stbtt_fontinfo *local_328;
  ulong local_320;
  long local_318;
  float *local_310;
  int local_304;
  float local_300;
  float local_2fc;
  uint local_2f8;
  uint local_2f4;
  float local_2f0;
  int local_2ec;
  stbrp_context *local_2e8;
  long local_2e0;
  float *local_2d8;
  ulong local_2d0;
  float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  ImFontConfig *local_2b0;
  long local_2a8;
  size_t local_2a0;
  size_t local_298;
  uchar *local_290;
  undefined2 *local_288;
  ulong local_280;
  ulong local_278;
  int local_270;
  int local_26c;
  undefined1 local_268 [16];
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 local_248 [16];
  stbtt__buf local_238 [32];
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined6 uVar129;
  undefined8 uVar130;
  undefined1 auVar131 [12];
  undefined1 auVar132 [14];
  undefined1 auVar134 [16];
  undefined6 uVar153;
  undefined8 uVar154;
  undefined1 auVar155 [12];
  undefined1 auVar156 [14];
  undefined1 auVar160 [16];
  
  uVar130 = local_488._0_8_;
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  local_3c8 = 0;
  pvStack_3c0 = (void *)0x0;
  local_388 = 0;
  pvStack_380 = (void *)0x0;
  uVar48 = (atlas->ConfigData).Size;
  uVar86 = (ulong)(int)uVar48;
  if (0 < (long)uVar86) {
    uVar70 = 8;
    if (8 < uVar48) {
      uVar70 = (ulong)uVar48;
    }
    pvStack_3c0 = ImGui::MemAlloc(uVar70 * 0x110);
    local_3c8 = uVar70 << 0x20;
  }
  pvVar56 = pvStack_3c0;
  local_3c8 = CONCAT44(local_3c8._4_4_,uVar48);
  uVar48 = (atlas->Fonts).Size;
  uVar70 = 8;
  if (8 < uVar48) {
    uVar70 = (ulong)uVar48;
  }
  pvVar52 = ImGui::MemAlloc(uVar70 << 5);
  local_388 = CONCAT44((int)uVar70,uVar48);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_488._0_8_;
  local_488 = auVar99 << 0x40;
  auVar99 = local_488;
  local_488._8_8_ = uVar130;
  pvStack_380 = pvVar52;
  memset(pvVar56,0,uVar86 * 0x110);
  memset(pvVar52,0,(ulong)(uVar48 << 5));
  if (0 < (atlas->ConfigData).Size) {
    lVar84 = 0;
    local_488 = auVar99;
    do {
      pIVar68 = (atlas->ConfigData).Data + lVar84;
      lVar74 = lVar84 * 0x110;
      *(undefined4 *)((long)pvVar56 + lVar74 + 0xe0) = 0xffffffff;
      uVar70 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar70 < 1) {
        bVar90 = false;
        goto LAB_0020b4b4;
      }
      uVar82 = 0;
      while (pIVar13 = (atlas->Fonts).Data[uVar82], pIVar68->DstFont != pIVar13) {
        uVar82 = uVar82 + 1;
        bVar90 = false;
        if ((uVar70 <= uVar82) || (pIVar68->DstFont == pIVar13)) goto LAB_0020b4b4;
      }
      *(int *)((long)pvVar56 + lVar74 + 0xe0) = (int)uVar82;
      pbVar87 = (byte *)pIVar68->FontData;
      iVar69 = pIVar68->FontNo;
      bVar6 = *pbVar87;
      sVar47 = 0xffffffff;
      local_448._0_8_ = uVar86;
      uVar128 = SUB84(pvVar52,0);
      uVar152 = (undefined4)((ulong)pvVar52 >> 0x20);
      if (bVar6 < 0x4f) {
        if (bVar6 == 0) {
          if (pbVar87[1] == 1) goto LAB_00208162;
        }
        else if ((bVar6 == 0x31) && (pbVar87[1] == 0)) {
LAB_00208162:
          if ((pbVar87[2] == 0) && (pbVar87[3] == 0)) {
LAB_002081ce:
            sVar47 = -(uint)(iVar69 != 0);
          }
        }
      }
      else if (bVar6 == 0x4f) {
        if (((pbVar87[1] == 0x54) && (pbVar87[2] == 0x54)) && (pbVar87[3] == 0x4f))
        goto LAB_002081ce;
      }
      else if (bVar6 == 0x74) {
        bVar6 = pbVar87[1];
        if (bVar6 == 0x72) {
          if ((pbVar87[2] == 0x75) && (pbVar87[3] == 0x65)) goto LAB_002081ce;
        }
        else if (bVar6 == 0x74) {
          if ((pbVar87[2] == 99) && (pbVar87[3] == 0x66)) {
            uVar48 = *(uint *)(pbVar87 + 4);
            uVar48 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8 |
                     uVar48 << 0x18;
            if (((uVar48 == 0x20000) || (uVar48 == 0x10000)) &&
               (uVar48 = *(uint *)(pbVar87 + 8),
               iVar69 < (int)(uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8 |
                             uVar48 << 0x18))) {
              uVar48 = *(uint *)(pbVar87 + (long)iVar69 * 4 + 0xc);
              sVar47 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8 |
                       uVar48 << 0x18;
            }
          }
        }
        else if (((bVar6 == 0x79) && (pbVar87[2] == 0x70)) && (pbVar87[3] == 0x31))
        goto LAB_002081ce;
      }
      *(byte **)((long)pvVar56 + lVar74 + 8) = pbVar87;
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x10) = sVar47;
      *(undefined8 *)((long)pvVar56 + lVar74 + 0x40) = 0;
      *(undefined8 *)((long)pvVar56 + lVar74 + 0x48) = 0;
      local_368 = pIVar68;
      sVar41 = stbtt__find_table(pbVar87,sVar47,"cmap");
      uVar86 = (ulong)sVar41;
      sVar42 = stbtt__find_table(pbVar87,sVar47,"loca");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x18) = sVar42;
      sVar43 = stbtt__find_table(pbVar87,sVar47,"head");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x1c) = sVar43;
      sVar44 = stbtt__find_table(pbVar87,sVar47,"glyf");
      local_428._0_4_ = sVar44;
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x20) = sVar44;
      sVar44 = stbtt__find_table(pbVar87,sVar47,"hhea");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x24) = sVar44;
      sVar45 = stbtt__find_table(pbVar87,sVar47,"hmtx");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x28) = sVar45;
      sVar46 = stbtt__find_table(pbVar87,sVar47,"kern");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x2c) = sVar46;
      sVar46 = stbtt__find_table(pbVar87,sVar47,"GPOS");
      *(stbtt_uint32 *)((long)pvVar56 + lVar74 + 0x30) = sVar46;
      if (((sVar41 == 0) || (sVar43 == 0)) || ((sVar44 == 0 || (sVar45 == 0)))) {
LAB_0020b4e9:
        bVar90 = false;
        goto LAB_0020b4b4;
      }
      local_468._24_8_ = uVar86;
      if (local_428._0_4_ == 0) {
        local_358 = CONCAT44(local_358._4_4_,2);
        local_468.next = (stbtt__active_edge *)((ulong)local_468.next & 0xffffffff00000000);
        local_410._0_4_ = 0;
        local_46c = 0;
        sVar41 = stbtt__find_table(pbVar87,sVar47,"CFF ");
        uVar86 = local_448._0_8_;
        if (sVar41 != 0) {
          *(undefined8 *)((long)pvVar56 + lVar74 + 0x90) = 0;
          *(undefined8 *)((long)pvVar56 + lVar74 + 0x98) = 0;
          *(undefined8 *)((long)pvVar56 + lVar74 + 0x80) = 0;
          *(undefined8 *)((long)pvVar56 + lVar74 + 0x88) = 0;
          *(byte **)((long)pvVar56 + lVar74 + 0x40) = pbVar87 + sVar41;
          *(undefined8 *)((long)pvVar56 + lVar74 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar56 + lVar74 + 0x40);
          uVar130 = *(undefined8 *)((long)pvVar56 + lVar74 + 0x48);
          local_238[0].cursor = (int)uVar130;
          local_238[0].size = (int)((ulong)uVar130 >> 0x20);
          uVar48 = local_238[0].cursor + 2U;
          if (local_238[0].size < (int)(local_238[0].cursor + 2U)) {
            uVar48 = local_238[0].size;
          }
          if (local_238[0].cursor < -2) {
            uVar48 = local_238[0].size;
          }
          local_238[0].cursor = 0;
          if ((int)uVar48 < local_238[0].size) {
            local_238[0].cursor = (int)local_238[0].data[(int)uVar48];
          }
          if (local_238[0].size < local_238[0].cursor) {
            local_238[0].cursor = local_238[0].size;
          }
          stbtt__cff_get_index(local_238);
          sVar167 = stbtt__cff_get_index(local_238);
          _local_3d8 = stbtt__cff_index_get(sVar167,0);
          stbtt__cff_get_index(local_238);
          sVar167 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar56 + lVar74 + 0x60) = sVar167;
          stbtt__dict_get_ints((stbtt__buf *)local_3d8,0x11,1,(stbtt_uint32 *)&local_468);
          stbtt__dict_get_ints((stbtt__buf *)local_3d8,0x106,1,(stbtt_uint32 *)&local_358);
          stbtt__dict_get_ints((stbtt__buf *)local_3d8,0x124,1,(stbtt_uint32 *)&local_410);
          stbtt__dict_get_ints((stbtt__buf *)local_3d8,0x125,1,&local_46c);
          uVar130 = local_238[0]._8_8_;
          sVar167._4_12_ = in_stack_fffffffffffffb2c;
          sVar167.data._0_4_ = in_stack_fffffffffffffb28;
          fontdict.data._4_4_ = uVar152;
          fontdict.data._0_4_ = uVar128;
          fontdict.cursor = sVar43;
          fontdict.size = in_stack_fffffffffffffb5c;
          sVar167 = stbtt__get_subrs(sVar167,fontdict);
          sVar41 = local_46c;
          *(stbtt__buf *)((long)pvVar56 + lVar74 + 0x70) = sVar167;
          if (((stbtt_uint32)local_358 == 2) &&
             (sVar42 = (stbtt_uint32)local_468.next, (stbtt_uint32)local_468.next != 0)) {
            sVar44 = SUB84(uVar130,4);
            if ((stbtt_uint32)local_410 != 0) {
              uVar70 = (ulong)local_46c;
              if (uVar70 == 0) goto LAB_0020b4e9;
              sVar45 = (stbtt_uint32)local_410;
              if ((int)sVar44 < (int)(stbtt_uint32)local_410) {
                sVar45 = sVar44;
              }
              if ((int)(stbtt_uint32)local_410 < 0) {
                sVar45 = sVar44;
              }
              local_238[0].cursor = sVar45;
              sVar167 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar56 + lVar74 + 0x80) = sVar167;
              puVar55 = local_238[0].data + uVar70;
              lVar66 = (ulong)(local_238[0].size - sVar41) << 0x20;
              if ((int)(local_238[0].size - sVar41 | sVar41) < 0 || local_238[0].size < (int)sVar41)
              {
                puVar55 = (uchar *)0x0;
                lVar66 = 0;
              }
              *(uchar **)((long)pvVar56 + lVar74 + 0x90) = puVar55;
              *(long *)((long)pvVar56 + lVar74 + 0x98) = lVar66;
              sVar44 = local_238[0].size;
            }
            auVar119._8_8_ = 0;
            auVar119._0_8_ = local_488._8_8_;
            local_488 = auVar119 << 0x40;
            sVar41 = sVar42;
            if ((int)sVar44 < (int)sVar42) {
              sVar41 = sVar44;
            }
            if ((int)sVar42 < 0) {
              sVar41 = sVar44;
            }
            local_238[0].cursor = sVar41;
            sVar167 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar56 + lVar74 + 0x50) = sVar167;
            pvVar52 = (void *)CONCAT44(uVar152,uVar128);
            goto LAB_00208597;
          }
        }
        goto LAB_0020b4e9;
      }
      pvVar52 = (void *)CONCAT44(uVar152,uVar128);
      uVar86 = local_448._0_8_;
      if (sVar42 == 0) goto LAB_0020b4e9;
LAB_00208597:
      sVar47 = stbtt__find_table(pbVar87,sVar47,"maxp");
      if (sVar47 == 0) {
        uVar48 = 0xffff;
      }
      else {
        uVar48 = (uint)(ushort)(*(ushort *)(pbVar87 + (ulong)sVar47 + 4) << 8 |
                               *(ushort *)(pbVar87 + (ulong)sVar47 + 4) >> 8);
      }
      *(uint *)((long)pvVar56 + lVar74 + 0x14) = uVar48;
      *(undefined4 *)((long)pvVar56 + lVar74 + 0x34) = 0xffffffff;
      uVar38 = *(ushort *)(pbVar87 + (local_468._24_8_ & 0xffffffff) + 2) << 8 |
               *(ushort *)(pbVar87 + (local_468._24_8_ & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvVar56 + lVar74 + 0x38) = 0;
      iVar69 = 0;
      if (uVar38 == 0) goto LAB_0020b4e9;
      uVar48 = local_468.sy + 4;
      uVar70 = (ulong)uVar38;
      do {
        uVar38 = *(ushort *)(pbVar87 + uVar48) << 8 | *(ushort *)(pbVar87 + uVar48) >> 8;
        if ((uVar38 == 0) ||
           ((uVar38 == 3 &&
            ((uVar38 = *(ushort *)(pbVar87 + (ulong)uVar48 + 2) << 8 |
                       *(ushort *)(pbVar87 + (ulong)uVar48 + 2) >> 8, uVar38 == 10 || (uVar38 == 1))
            )))) {
          uVar72 = *(uint *)(pbVar87 + (ulong)uVar48 + 4);
          iVar69 = (uVar72 >> 0x18 | (uVar72 & 0xff0000) >> 8 | (uVar72 & 0xff00) << 8 |
                   uVar72 << 0x18) + local_468.sy;
          *(int *)((long)pvVar56 + lVar74 + 0x38) = iVar69;
        }
        uVar48 = uVar48 + 8;
        uVar70 = uVar70 - 1;
      } while (uVar70 != 0);
      if (iVar69 == 0) goto LAB_0020b4e9;
      *(uint *)((long)pvVar56 + lVar74 + 0x3c) =
           (uint)(ushort)(*(ushort *)(pbVar87 + (long)(int)sVar43 + 0x32) << 8 |
                         *(ushort *)(pbVar87 + (long)(int)sVar43 + 0x32) >> 8);
      pIVar64 = local_368->GlyphRanges;
      if (pIVar64 == (ImWchar *)0x0) {
        pIVar64 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar56 + lVar74 + 0xd8) = pIVar64;
      IVar9 = *pIVar64;
      while (IVar9 != 0) {
        uVar38 = pIVar64[1];
        if (uVar38 == 0) break;
        uVar48 = *(uint *)((long)pvVar56 + lVar74 + 0xe4);
        uVar72 = (uint)uVar38;
        if ((int)(uint)uVar38 < (int)uVar48) {
          uVar72 = uVar48;
        }
        *(uint *)((long)pvVar56 + lVar74 + 0xe4) = uVar72;
        IVar9 = pIVar64[2];
        pIVar64 = pIVar64 + 2;
      }
      piVar53 = (int *)((long)*(int *)((long)pvVar56 + lVar74 + 0xe0) * 0x20 + (long)pvVar52);
      *piVar53 = *piVar53 + 1;
      iVar69 = *(int *)((long)pvVar56 + lVar74 + 0xe4);
      if (iVar69 < piVar53[1]) {
        iVar69 = piVar53[1];
      }
      piVar53[1] = iVar69;
      lVar84 = lVar84 + 1;
    } while (lVar84 < (atlas->ConfigData).Size);
  }
  local_488._0_8_ = 0;
  if ((int)uVar86 < 1) {
LAB_002089f5:
    local_468.sy = 0.0;
    local_468.ey = 0.0;
  }
  else {
    lVar84 = 0;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_488._8_8_;
    local_488 = auVar109 << 0x40;
    do {
      pvVar52 = pvStack_380;
      lVar74 = lVar84 * 0x110;
      iVar69 = *(int *)((long)pvVar56 + lVar74 + 0xe0);
      ImBitVector::Create((ImBitVector *)((long)pvVar56 + lVar74 + 0xf0),
                          *(int *)((long)pvVar56 + lVar74 + 0xe4) + 1);
      if (*(int *)((long)pvVar52 + (long)iVar69 * 0x20 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar52 + (long)iVar69 * 0x20 + 0x10),
                            *(int *)((long)pvVar52 + (long)iVar69 * 0x20 + 4) + 1);
      }
      puVar65 = *(ushort **)((long)pvVar56 + lVar74 + 0xd8);
      uVar38 = *puVar65;
      while( true ) {
        uVar86 = (ulong)uVar38;
        if (uVar38 == 0) break;
        uVar10 = puVar65[1];
        uVar48 = (uint)uVar10;
        if (uVar10 == 0) break;
        uVar128 = SUB84(puVar65,0);
        uVar152 = (undefined4)((ulong)puVar65 >> 0x20);
        if (uVar38 <= uVar10) {
          do {
            auVar99 = local_488;
            uVar72 = (uint)uVar86;
            uVar88 = 1 << ((byte)uVar86 & 0x1f);
            if (((*(uint *)(*(long *)((long)pvVar52 + (long)iVar69 * 0x20 + 0x18) +
                           (uVar86 >> 5) * 4) >> (uVar72 & 0x1f) & 1) == 0) &&
               (iVar49 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar56 + lVar74 + 8),
                                    *(int *)((long)pvVar56 + lVar74 + 0x38)), iVar49 != 0)) {
              piVar53 = (int *)((long)pvVar56 + lVar74 + 0xe8);
              *piVar53 = *piVar53 + 1;
              piVar53 = (int *)((long)pvVar52 + (long)iVar69 * 0x20 + 8);
              *piVar53 = *piVar53 + 1;
              uVar86 = (ulong)(uint)((int)(uVar86 >> 5) << 2);
              puVar78 = (uint *)(*(long *)((long)pvVar56 + lVar74 + 0xf8) + uVar86);
              *puVar78 = *puVar78 | uVar88;
              puVar78 = (uint *)(*(long *)((long)pvVar52 + (long)iVar69 * 0x20 + 0x18) + uVar86);
              *puVar78 = *puVar78 | uVar88;
              iVar49 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar49 + 1;
              local_488._8_8_ = auVar99._8_8_;
              uVar48 = (uint)*(ushort *)(CONCAT44(uVar152,uVar128) + 2);
            }
            uVar86 = (ulong)(uVar72 + 1);
          } while (uVar72 < uVar48);
        }
        uVar38 = *(ushort *)(CONCAT44(uVar152,uVar128) + 4);
        puVar65 = (ushort *)(CONCAT44(uVar152,uVar128) + 4);
      }
      lVar84 = lVar84 + 1;
      uVar86 = (ulong)(int)local_3c8;
    } while (lVar84 < (long)uVar86);
    local_468._24_8_ = ZEXT28(CONCAT11((char)(uVar38 >> 8),0 < (int)local_3c8));
    if ((int)local_3c8 < 1) goto LAB_002089f5;
    uVar70 = 0;
    do {
      lVar84 = uVar70 * 0x110;
      iVar69 = *(int *)((long)pvVar56 + lVar84 + 0xe8);
      if (*(int *)((long)pvVar56 + lVar84 + 0x104) < iVar69) {
        pvVar54 = ImGui::MemAlloc((long)iVar69 << 2);
        pvVar52 = *(void **)((long)pvVar56 + lVar84 + 0x108);
        if (pvVar52 != (void *)0x0) {
          memcpy(pvVar54,pvVar52,(long)*(int *)((long)pvVar56 + lVar84 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar56 + lVar84 + 0x108));
        }
        *(void **)((long)pvVar56 + lVar84 + 0x108) = pvVar54;
        *(int *)((long)pvVar56 + lVar84 + 0x104) = iVar69;
      }
      lVar74 = (long)*(int *)((long)pvVar56 + lVar84 + 0xf0);
      puVar78 = *(uint **)((long)pvVar56 + lVar84 + 0xf8);
      if (0 < lVar74) {
        local_428._0_8_ = uVar70;
        local_448._0_8_ = uVar86;
        puVar1 = puVar78 + lVar74;
        iVar69 = 0;
        do {
          uVar128 = SUB84(puVar78,0);
          uVar152 = (undefined4)((ulong)puVar78 >> 0x20);
          uVar48 = *puVar78;
          if (uVar48 != 0) {
            uVar72 = 0;
            do {
              if ((uVar48 >> (uVar72 & 0x1f) & 1) != 0) {
                iVar49 = *(int *)((long)pvVar56 + lVar84 + 0x100);
                if (iVar49 == *(int *)((long)pvVar56 + lVar84 + 0x104)) {
                  if (iVar49 == 0) {
                    iVar50 = 8;
                  }
                  else {
                    iVar50 = iVar49 / 2 + iVar49;
                  }
                  iVar51 = iVar49 + 1;
                  if (iVar49 + 1 < iVar50) {
                    iVar51 = iVar50;
                  }
                  pvVar52 = ImGui::MemAlloc((long)iVar51 << 2);
                  pvVar54 = *(void **)((long)pvVar56 + lVar84 + 0x108);
                  if (pvVar54 != (void *)0x0) {
                    memcpy(pvVar52,pvVar54,(long)*(int *)((long)pvVar56 + lVar84 + 0x100) << 2);
                    ImGui::MemFree(*(void **)((long)pvVar56 + lVar84 + 0x108));
                  }
                  *(void **)((long)pvVar56 + lVar84 + 0x108) = pvVar52;
                  *(int *)((long)pvVar56 + lVar84 + 0x104) = iVar51;
                  iVar49 = *(int *)((long)pvVar56 + lVar84 + 0x100);
                }
                else {
                  pvVar52 = *(void **)((long)pvVar56 + lVar84 + 0x108);
                }
                *(uint *)((long)pvVar52 + (long)iVar49 * 4) = iVar69 + uVar72;
                piVar53 = (int *)((long)pvVar56 + lVar84 + 0x100);
                *piVar53 = *piVar53 + 1;
              }
              uVar72 = uVar72 + 1;
            } while (uVar72 != 0x20);
          }
          puVar78 = (uint *)(CONCAT44(uVar152,uVar128) + 4);
          iVar69 = iVar69 + 0x20;
        } while (puVar78 < puVar1);
        puVar78 = *(uint **)((long)pvVar56 + lVar84 + 0xf8);
        uVar86 = local_448._0_8_;
        uVar70 = local_428._0_8_;
      }
      if (puVar78 != (uint *)0x0) {
        *(undefined8 *)((long)pvVar56 + lVar84 + 0xf0) = 0;
        ImGui::MemFree(puVar78);
        *(undefined8 *)((long)pvVar56 + lVar84 + 0xf8) = 0;
      }
      uVar70 = uVar70 + 1;
    } while (uVar70 < uVar86);
  }
  pvVar52 = pvStack_380;
  local_448._0_8_ = uVar86;
  uVar86 = (ulong)(int)local_388;
  if ((long)uVar86 < 1) {
    if (pvStack_380 != (void *)0x0) goto LAB_00208a54;
  }
  else {
    puVar61 = (undefined8 *)((long)pvStack_380 + 0x18);
    uVar70 = 0;
    do {
      if ((void *)*puVar61 != (void *)0x0) {
        puVar61[-1] = 0;
        ImGui::MemFree((void *)*puVar61);
        *puVar61 = 0;
      }
      uVar70 = uVar70 + 1;
      puVar61 = puVar61 + 4;
    } while (uVar70 < uVar86);
LAB_00208a54:
    local_388 = 0;
    ImGui::MemFree(pvVar52);
    pvStack_380 = (void *)0x0;
  }
  _local_3d8 = (stbtt__buf)ZEXT816(0);
  local_358 = 0;
  pvStack_350 = (void *)0x0;
  uVar48 = (uint)local_488._0_8_;
  uVar86 = 8;
  if (8 < uVar48) {
    uVar86 = local_488._0_8_ & 0xffffffff;
  }
  pvVar52 = ImGui::MemAlloc(uVar86 * 0x18);
  pvStack_3d0 = pvVar52;
  local_3d8._4_4_ = (int)uVar86;
  uVar86 = 8;
  if (8 < uVar48) {
    uVar86 = local_488._0_8_ & 0xffffffff;
  }
  local_3d8._0_4_ = uVar48;
  pvVar54 = ImGui::MemAlloc(uVar86 * 0x1c);
  local_358._4_4_ = (undefined4)uVar86;
  local_358 = CONCAT44(local_358._4_4_,uVar48);
  iVar69 = 0;
  pvStack_350 = pvVar54;
  memset(pvVar52,0,(ulong)(uVar48 * 0x18));
  memset(pvVar54,0,(ulong)(uVar48 * 0x1c));
  fVar98 = 0.0;
  if (local_468.sy._0_1_ != '\0') {
    pIVar85 = (ImFontConfig *)(ulong)(uint)local_448._0_4_;
    pIVar68 = (ImFontConfig *)0x0;
    iVar50 = 0;
    iVar49 = 0;
    uVar128 = SUB84(pvVar52,0);
    uVar152 = (undefined4)((ulong)pvVar52 >> 0x20);
    local_368 = pIVar85;
    do {
      iVar51 = *(int *)((long)pvVar56 + (long)pIVar68 * 0x110 + 0xe8);
      if (iVar51 != 0) {
        psVar89 = (stbtt_fontinfo *)((long)pIVar68 * 0x110 + (long)pvVar56);
        *(void **)&psVar89[1].hmtx = (void *)((long)iVar50 * 0x18 + (long)pvVar52);
        pvVar76 = (void *)((long)iVar49 * 0x1c + (long)pvVar54);
        *(void **)&psVar89[1].gpos = pvVar76;
        pIVar14 = (atlas->ConfigData).Data;
        uVar168 = SUB84(pIVar68,0);
        uVar169 = (undefined4)((ulong)pIVar68 >> 0x20);
        *(float *)&psVar89[1].userdata = pIVar14[(long)pIVar68].SizePixels;
        *(undefined4 *)((long)&psVar89[1].userdata + 4) = 0;
        psVar89[1].data = *(uchar **)&psVar89[1].gsubrs.cursor;
        iVar12 = *(int *)&psVar89[1].gsubrs.data;
        psVar89[1].fontstart = iVar12;
        *(void **)&psVar89[1].loca = pvVar76;
        *(char *)&psVar89[1].glyf = (char)pIVar14[(long)pIVar68].OversampleH;
        *(char *)((long)&psVar89[1].glyf + 1) = (char)pIVar14[(long)pIVar68].OversampleV;
        fVar98 = pIVar14[(long)pIVar68].SizePixels;
        if (fVar98 <= 0.0) {
          fVar98 = -fVar98;
          uVar48 = (uint)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                 *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
        }
        else {
          puVar55 = psVar89->data;
          lVar84 = (long)psVar89->hhea;
          uVar48 = ((int)(short)((ushort)puVar55[lVar84 + 4] << 8) | (uint)puVar55[lVar84 + 5]) -
                   ((int)(short)((ushort)puVar55[lVar84 + 6] << 8) | (uint)puVar55[lVar84 + 7]);
          pvVar52 = (void *)CONCAT44(uVar152,uVar128);
        }
        fVar98 = fVar98 / (float)(int)uVar48;
        iVar50 = iVar50 + iVar51;
        iVar49 = iVar49 + iVar51;
        if (0 < iVar12) {
          local_428._0_4_ = iVar49;
          iVar49 = atlas->TexGlyphPadding + -1;
          lVar84 = 0;
          lVar74 = 0;
          do {
            iVar51 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar89->data,psVar89->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar89,iVar51,(float)pIVar14[(long)pIVar68].OversampleH * fVar98,
                       (float)pIVar14[(long)pIVar68].OversampleV * fVar98,fVar98,in_XMM3._0_4_,
                       (int *)local_238,(int *)&local_468,(int *)&local_410,(int *)&local_46c);
            *(stbtt_uint32 *)(*(long *)&psVar89[1].hmtx + 4 + lVar84) =
                 (((stbtt_uint32)local_410 + iVar49) - (int)local_238[0].data) +
                 pIVar14[(long)pIVar68].OversampleH;
            *(stbtt_uint32 *)(*(long *)&psVar89[1].hmtx + 8 + lVar84) =
                 ((local_46c + iVar49) - (stbtt_uint32)local_468.next) +
                 pIVar14[(long)pIVar68].OversampleV;
            iVar69 = iVar69 + *(int *)(*(long *)&psVar89[1].hmtx + 8 + lVar84) *
                              *(int *)(*(long *)&psVar89[1].hmtx + 4 + lVar84);
            lVar74 = lVar74 + 1;
            lVar84 = lVar84 + 0x18;
          } while (lVar74 < *(int *)&psVar89[1].gsubrs.data);
          pvVar52 = (void *)CONCAT44(uVar152,uVar128);
          pIVar68 = (ImFontConfig *)CONCAT44(uVar169,uVar168);
          pIVar85 = local_368;
          iVar49 = local_428._0_4_;
        }
      }
      pIVar68 = (ImFontConfig *)((long)&pIVar68->FontData + 1);
    } while (pIVar68 < pIVar85);
    fVar98 = (float)iVar69;
  }
  if (fVar98 < 0.0) {
    fVar98 = sqrtf(fVar98);
  }
  else {
    fVar98 = SQRT(fVar98);
  }
  uVar130 = local_448._0_8_;
  atlas->TexHeight = 0;
  local_468.fdx = (float)atlas->TexDesiredWidth;
  if ((int)local_468.fdx < 1) {
    iVar69 = (int)fVar98;
    local_468.fdx = 5.73972e-42;
    if ((iVar69 < 0xb33) && (local_468.fdx = 2.86986e-42, iVar69 < 0x599)) {
      local_468.fdx = (float)((uint)(0x2cb < iVar69) * 0x200 + 0x200);
    }
  }
  atlas->TexWidth = (int)local_468.fdx;
  iVar69 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar48 = (int)local_468.fdx - iVar69;
  local_430 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar48 << 4);
  auVar119 = _DAT_0025cb60;
  auVar99 = _DAT_0024c080;
  if ((ptr == (stbrp_context *)0x0) || (local_430 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_430 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_430);
    }
    local_430 = (stbrp_node *)0x0;
    iVar69 = 0;
    local_468.fdx = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((int)uVar48 < 2) {
      uVar86 = 0;
    }
    else {
      uVar86 = (ulong)(uVar48 - 1);
      uVar70 = (ulong)(uVar48 & 0x7ffffffe);
      lVar84 = uVar86 - 1;
      auVar91._8_4_ = (int)lVar84;
      auVar91._0_8_ = lVar84;
      auVar91._12_4_ = (int)((ulong)lVar84 >> 0x20);
      ppsVar79 = &local_430[1].next;
      auVar91 = auVar91 ^ _DAT_0024c080;
      in_XMM3._8_4_ = 0xffffffff;
      in_XMM3._0_8_ = 0xffffffffffffffff;
      in_XMM3._12_4_ = 0xffffffff;
      auVar142 = _DAT_002535b0;
      do {
        auVar109 = auVar142 ^ auVar99;
        auVar117._0_4_ = -(uint)(auVar91._0_4_ < auVar109._0_4_);
        auVar117._4_4_ = -(uint)(auVar91._4_4_ < auVar109._4_4_);
        auVar117._8_4_ = -(uint)(auVar91._8_4_ < auVar109._8_4_);
        auVar117._12_4_ = -(uint)(auVar91._12_4_ < auVar109._12_4_);
        auVar110._4_4_ = -(uint)(auVar109._4_4_ == auVar91._4_4_);
        auVar110._12_4_ = -(uint)(auVar109._12_4_ == auVar91._12_4_);
        auVar110._0_4_ = auVar110._4_4_;
        auVar110._8_4_ = auVar110._12_4_;
        auVar118._4_4_ = auVar117._4_4_;
        auVar118._0_4_ = auVar117._4_4_;
        auVar118._8_4_ = auVar117._12_4_;
        auVar118._12_4_ = auVar117._12_4_;
        auVar118 = auVar118 | auVar110 & auVar117;
        lVar84 = auVar142._8_8_;
        if ((~auVar118._0_4_ & 1) != 0) {
          ppsVar79[-2] = local_430 + auVar142._0_8_ + 1;
        }
        if (((auVar118 ^ in_XMM3) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar79 = local_430 + (lVar84 - in_XMM3._8_8_);
        }
        auVar142._0_8_ = auVar142._0_8_ + auVar119._0_8_;
        auVar142._8_8_ = lVar84 + auVar119._8_8_;
        ppsVar79 = ppsVar79 + 4;
        uVar70 = uVar70 - 2;
      } while (uVar70 != 0);
    }
    local_430[uVar86].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_430;
    ptr->active_head = ptr->extra;
    ptr->width = uVar48;
    ptr->height = 0x8000 - iVar69;
    ptr->num_nodes = uVar48;
    ptr->align = (int)((uVar48 - 1) + uVar48) / (int)uVar48;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = uVar48;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_2e8 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (local_468.sy._0_1_ != '\0') {
    uVar86 = 0;
    do {
      lVar84 = uVar86 * 0x110;
      iVar49 = *(int *)((long)pvVar56 + lVar84 + 0xe8);
      if (iVar49 != 0) {
        stbrp_pack_rects(local_2e8,*(stbrp_rect **)((long)pvVar56 + lVar84 + 200),iVar49);
        iVar49 = *(int *)((long)pvVar56 + lVar84 + 0xe8);
        if (0 < iVar49) {
          lVar74 = 0x14;
          lVar66 = 0;
          do {
            lVar57 = *(long *)((long)pvVar56 + lVar84 + 200);
            if (*(int *)(lVar57 + lVar74) != 0) {
              iVar49 = *(int *)(lVar57 + -0xc + lVar74) + *(int *)(lVar57 + -4 + lVar74);
              if (iVar49 < atlas->TexHeight) {
                iVar49 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar49;
              iVar49 = *(int *)((long)pvVar56 + lVar84 + 0xe8);
            }
            lVar66 = lVar66 + 1;
            lVar74 = lVar74 + 0x18;
          } while (lVar66 < iVar49);
        }
      }
      uVar86 = uVar86 + 1;
    } while (uVar86 < (uVar130 & 0xffffffff));
  }
  uVar48 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar48 = (int)(uVar48 - 1) >> 1 | uVar48 - 1;
    uVar48 = (int)uVar48 >> 2 | uVar48;
    uVar48 = (int)uVar48 >> 4 | uVar48;
    uVar48 = (int)uVar48 >> 8 | uVar48;
    uVar48 = (int)uVar48 >> 0x10 | uVar48;
  }
  iVar49 = uVar48 + 1;
  atlas->TexHeight = iVar49;
  auVar92._0_4_ = (float)atlas->TexWidth;
  auVar92._4_4_ = (float)iVar49;
  auVar92._8_8_ = 0;
  auVar99 = divps(_DAT_0024c0c0,auVar92);
  atlas->TexUvScale = auVar99._0_8_;
  puVar55 = (uchar *)ImGui::MemAlloc((long)(iVar49 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar55;
  memset(puVar55,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (local_468.sy._0_1_ != '\0') {
    local_348 = atlas->TexPixelsAlpha8;
    lVar74 = (long)(int)local_468.fdx;
    local_258 = iVar69;
    iStack_254 = iVar69;
    iStack_250 = iVar69;
    iStack_24c = iVar69;
    lVar84 = 0;
    auVar99 = _DAT_0024c080;
    do {
      local_2e0 = lVar84;
      if (*(int *)((long)pvStack_3c0 + lVar84 * 0x110 + 0xe8) != 0) {
        psVar89 = (stbtt_fontinfo *)((long)pvStack_3c0 + lVar84 * 0x110);
        local_2c8 = *(float *)&psVar89[1].userdata;
        if (local_2c8 <= 0.0) {
          local_2c8 = (float)((uint)local_2c8 ^ auVar99._0_4_);
          uVar48 = (uint)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                 *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
          uStack_2c4 = auVar99._4_4_;
          uStack_2c0 = auVar99._8_4_;
          uStack_2bc = auVar99._12_4_;
        }
        else {
          puVar55 = psVar89->data;
          lVar84 = (long)psVar89->hhea;
          uVar48 = ((int)(short)((ushort)puVar55[lVar84 + 4] << 8) | (uint)puVar55[lVar84 + 5]) -
                   ((int)(short)((ushort)puVar55[lVar84 + 6] << 8) | (uint)puVar55[lVar84 + 7]);
          uStack_2c4 = 0;
          uStack_2c0 = 0;
          uStack_2bc = 0;
        }
        local_2c8 = local_2c8 / (float)(int)uVar48;
        bVar6 = (byte)psVar89[1].glyf;
        fVar98 = (float)bVar6;
        local_398 = 0.0;
        local_39c = 0.0;
        if (bVar6 != 0) {
          local_39c = (float)(int)(1 - (uint)bVar6) / (fVar98 + fVar98);
        }
        bVar7 = *(byte *)((long)&psVar89[1].glyf + 1);
        uVar86 = (ulong)bVar7;
        fVar108 = (float)bVar7;
        if (bVar7 != 0) {
          local_398 = (float)(int)(1 - (uint)bVar7) / (fVar108 + fVar108);
        }
        local_2b0 = (atlas->ConfigData).Data;
        if (0 < psVar89[1].fontstart) {
          lVar84._0_4_ = psVar89[1].hmtx;
          lVar84._4_4_ = psVar89[1].kern;
          local_2fc = 1.0 / fVar98;
          local_300 = 1.0 / fVar108;
          local_404 = fVar98 * local_2c8;
          fVar108 = fVar108 * local_2c8;
          fVar98 = fVar108;
          if (local_404 <= fVar108) {
            fVar98 = local_404;
          }
          local_394 = (0.35 / fVar98) * (0.35 / fVar98);
          local_268 = ZEXT416((uint)fVar108);
          local_248._0_4_ = (uint)fVar108 ^ auVar99._0_4_;
          local_248._4_4_ = auVar99._4_4_;
          local_248._8_4_ = auVar99._8_4_;
          local_248._12_4_ = auVar99._12_4_;
          local_278 = (ulong)(uint)bVar6;
          local_280 = (ulong)(uint)bVar7;
          uVar82 = 0xffffffff;
          uVar70 = 0;
          local_468.fdy = (float)(int)uVar86;
          local_468.direction = (float)(int)(uVar86 >> 0x20);
          local_330 = lVar84;
          local_328 = psVar89;
          local_3e0 = (ulong)bVar6;
          do {
            if (*(int *)(lVar84 + 0x14 + uVar70 * 0x18) != 0) {
              lVar66 = lVar84 + uVar70 * 0x18;
              iVar69 = (int)*(undefined8 *)(lVar66 + 4);
              iVar49 = (int)((ulong)*(undefined8 *)(lVar66 + 4) >> 0x20);
              if (iVar69 == 0) {
                if ((iVar49 == 0) && (-1 < (int)(uint)uVar82)) {
                  lVar66 = *(long *)&psVar89[1].loca;
                  puVar2 = (undefined4 *)(lVar66 + uVar82 * 0x1c);
                  uVar128 = *puVar2;
                  uVar152 = puVar2[1];
                  uVar168 = puVar2[2];
                  uVar169 = puVar2[3];
                  *(undefined1 (*) [16])(lVar66 + 0xc + uVar70 * 0x1c) =
                       *(undefined1 (*) [16])(lVar66 + 0xc + uVar82 * 0x1c);
                  puVar2 = (undefined4 *)(lVar66 + uVar70 * 0x1c);
                  *puVar2 = uVar128;
                  puVar2[1] = uVar152;
                  puVar2[2] = uVar168;
                  puVar2[3] = uVar169;
                }
              }
              else if (iVar49 != 0) {
                local_288 = (undefined2 *)(uVar70 * 0x1c + *(long *)&psVar89[1].loca);
                local_400 = (uint)uVar82;
                local_320 = uVar70;
                uVar48 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar89->data,psVar89->index_map);
                uVar130 = *(undefined8 *)(lVar66 + 0xc);
                fVar98 = (float)(iVar69 - local_258);
                *(float *)(lVar66 + 4) = fVar98;
                *(int *)(lVar66 + 8) = iVar49 - iStack_254;
                *(int *)(lVar66 + 0xc) = (int)uVar130 + iStack_250;
                *(int *)(lVar66 + 0x10) = (int)((ulong)uVar130 >> 0x20) + iStack_24c;
                puVar55 = psVar89->data;
                uVar38 = *(ushort *)(puVar55 + (long)psVar89->hhea + 0x22) << 8 |
                         *(ushort *)(puVar55 + (long)psVar89->hhea + 0x22) >> 8;
                iVar69 = psVar89->hmtx;
                lVar84 = (ulong)uVar38 * 4 + (long)iVar69 + -4;
                lVar57 = (ulong)uVar38 * 4 + (long)iVar69 + -3;
                if ((int)uVar48 < (int)(uint)uVar38) {
                  lVar84 = (long)(int)(uVar48 * 4) + (long)iVar69;
                  lVar57 = (long)(int)(uVar48 * 4) + 1 + (long)iVar69;
                }
                local_2f8 = (uint)puVar55[lVar57];
                local_2f4 = (uint)puVar55[lVar84];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar89,uVar48,local_404,(float)local_268._0_4_,fVar98,in_XMM3._0_4_,
                           &local_38c,&local_390,&local_26c,&local_270);
                iVar69 = *(int *)(lVar66 + 0xc);
                iVar49 = *(int *)(lVar66 + 0x10);
                local_3e8 = (ulong)*(uint *)(lVar66 + 4);
                local_3b8 = (ulong)*(uint *)(lVar66 + 8);
                local_318 = lVar66;
                local_2d0 = (ulong)uVar48;
                uVar48 = stbtt_GetGlyphShape(psVar89,uVar48,(stbtt_vertex **)&local_410);
                uVar72 = ((int)local_3e8 - (int)local_3e0) + 1;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_328,(int)local_2d0,local_404,(float)local_268._0_4_,fVar98,
                           in_XMM3._0_4_,(int *)&local_46c,&local_2ec,(int *)0x0,(int *)0x0);
                sVar47 = local_46c;
                if (uVar72 != 0) {
                  iVar50 = ((int)local_3b8 - (int)uVar86) + 1;
                  if ((iVar50 != 0) && (0 < (int)uVar48)) {
                    local_290 = local_348 + iVar49 * lVar74 + (long)iVar69;
                    local_3e8 = (ulong)(uint)((int)local_3e8 - (int)local_3e0);
                    local_3b8 = (ulong)(uint)((int)local_3b8 - (int)uVar86);
                    lVar84 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                    local_3f4 = local_2ec;
                    lVar66 = 0;
                    uVar88 = 0;
                    do {
                      uVar88 = uVar88 + (*(char *)(lVar84 + 0xc + lVar66) == '\x01');
                      lVar66 = lVar66 + 0xe;
                    } while ((ulong)uVar48 * 0xe != lVar66);
                    if (uVar88 != 0) {
                      uVar128 = 0;
                      pvVar56 = ImGui::MemAlloc((ulong)uVar88 * 4);
                      if (pvVar56 != (void *)0x0) {
                        bVar63 = false;
                        iVar49 = 0;
                        auVar33._8_8_ = 0;
                        auVar33._0_8_ = local_428._8_8_;
                        local_428 = auVar33 << 0x40;
                        iVar69 = 0;
                        local_3a8 = pvVar56;
                        bVar90 = true;
                        do {
                          bVar71 = bVar90;
                          pvVar56 = local_3a8;
                          if (bVar63) {
                            pvVar52 = ImGui::MemAlloc((long)iVar69 << 3);
                            local_428._0_8_ = pvVar52;
                            if (pvVar52 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              uVar86 = local_468._16_8_;
                              ImGui::MemFree(pvVar56);
                              goto LAB_0020a591;
                            }
                          }
                          local_238[0].data =
                               (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                          fVar98 = 0.0;
                          fVar108 = 0.0;
                          uVar73 = 0xffffffff;
                          lVar66 = 0;
                          do {
                            iVar69 = (int)local_238[0].data;
                            switch(*(undefined1 *)(lVar84 + 0xc + lVar66)) {
                            case 1:
                              if (-1 < (int)uVar73) {
                                *(int *)((long)local_3a8 + (ulong)uVar73 * 4) =
                                     (int)local_238[0].data - iVar49;
                              }
                              uVar73 = uVar73 + 1;
                              auVar99 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar66)),
                                                ZEXT416(*(uint *)(lVar84 + lVar66)),0x60);
                              fVar98 = (float)(auVar99._0_4_ >> 0x10);
                              fVar108 = (float)(auVar99._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              iVar49 = iVar69;
                              if ((stbtt__point *)local_428._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_428._0_8_ + (long)iVar69 * 8))->x = fVar98;
                                ((stbtt__point *)(local_428._0_8_ + (long)iVar69 * 8))->y = fVar108;
                              }
                              break;
                            case 2:
                              lVar57 = (long)(int)local_238[0].data;
                              auVar99 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar66)),
                                                ZEXT416(*(uint *)(lVar84 + lVar66)),0x60);
                              fVar98 = (float)(auVar99._0_4_ >> 0x10);
                              fVar108 = (float)(auVar99._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              if ((stbtt__point *)local_428._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_428._0_8_ + lVar57 * 8))->x = fVar98;
                                ((stbtt__point *)(local_428._0_8_ + lVar57 * 8))->y = fVar108;
                              }
                              break;
                            case 3:
                              fVar113 = (float)(int)*(short *)(lVar84 + 6 + lVar66);
                              in_XMM3 = ZEXT416((uint)fVar113);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)local_428._0_8_,(int *)local_238,fVar98,
                                         fVar108,(float)(int)*(short *)(lVar84 + 4 + lVar66),fVar113
                                         ,(float)(int)*(short *)(lVar84 + lVar66),
                                         (float)(int)*(short *)(lVar84 + 2 + lVar66),local_394,0);
                              goto LAB_0020984c;
                            case 4:
                              fVar113 = (float)(int)*(short *)(lVar84 + 6 + lVar66);
                              in_XMM3 = ZEXT416((uint)fVar113);
                              stbtt__tesselate_cubic
                                        ((stbtt__point *)local_428._0_8_,(int *)local_238,fVar98,
                                         fVar108,(float)(int)*(short *)(lVar84 + 4 + lVar66),fVar113
                                         ,(float)(int)*(short *)(lVar84 + 8 + lVar66),
                                         (float)(int)*(short *)(lVar84 + 10 + lVar66),
                                         (float)(int)*(short *)(lVar84 + lVar66),
                                         (float)(int)*(short *)(lVar84 + 2 + lVar66),local_394,0);
LAB_0020984c:
                              auVar99 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar66)),
                                                ZEXT416(*(uint *)(lVar84 + lVar66)),0x60);
                              fVar98 = (float)(auVar99._0_4_ >> 0x10);
                              fVar108 = (float)(auVar99._4_4_ >> 0x10);
                            }
                            pvVar56 = local_3a8;
                            uVar86 = local_468._16_8_;
                            lVar66 = lVar66 + 0xe;
                          } while ((ulong)uVar48 * 0xe != lVar66);
                          *(int *)((long)local_3a8 + (long)(int)uVar73 * 4) =
                               (int)local_238[0].data - iVar49;
                          bVar63 = true;
                          iVar69 = (int)local_238[0].data;
                          bVar90 = false;
                        } while (bVar71);
                        if (local_428._0_8_ != 0) {
                          lVar84 = 0;
                          lVar66 = 0;
                          do {
                            lVar66 = (long)(int)lVar66 +
                                     (long)*(int *)((long)local_3a8 + lVar84 * 4);
                            lVar84 = lVar84 + 1;
                          } while (CONCAT44(uVar128,uVar88) != lVar84);
                          psVar58 = (stbtt__edge *)ImGui::MemAlloc(lVar66 * 0x14 + 0x14);
                          pvVar52 = local_3a8;
                          if (psVar58 != (stbtt__edge *)0x0) {
                            lVar84 = 0;
                            uVar48 = 0;
                            iVar69 = 0;
                            do {
                              iVar49 = *(int *)((long)pvVar56 + lVar84 * 4);
                              if (0 < iVar49) {
                                lVar66 = local_428._0_8_ + (long)iVar69 * 8;
                                uVar82 = (ulong)(iVar49 - 1);
                                lVar57 = local_428._0_8_ + 4 + (long)iVar69 * 8;
                                uVar70 = 0;
                                iVar51 = iVar49;
                                do {
                                  uVar86 = (ulong)(int)uVar82;
                                  fVar98 = *(float *)(lVar66 + 4 + uVar86 * 8);
                                  pfVar3 = (float *)(lVar57 + uVar70 * 8);
                                  if ((fVar98 != *pfVar3) || (NAN(fVar98) || NAN(*pfVar3))) {
                                    psVar83 = psVar58 + (int)uVar48;
                                    psVar58[(int)uVar48].invert = 0;
                                    fVar98 = *(float *)(lVar66 + 4 + uVar86 * 8);
                                    pfVar3 = (float *)(lVar57 + uVar70 * 8);
                                    uVar82 = uVar86;
                                    uVar77 = uVar70;
                                    if (*pfVar3 <= fVar98 && fVar98 != *pfVar3) {
                                      psVar83->invert = 1;
                                      uVar82 = uVar70;
                                      uVar77 = uVar86;
                                    }
                                    psVar83->x0 = *(float *)(lVar66 + uVar77 * 8) * local_404 + 0.0;
                                    psVar83->y0 = *(float *)(lVar66 + 4 + uVar77 * 8) *
                                                  local_248._0_4_ + 0.0;
                                    psVar83->x1 = *(float *)(lVar66 + uVar82 * 8) * local_404 + 0.0;
                                    psVar83->y1 = *(float *)(lVar66 + 4 + uVar82 * 8) *
                                                  local_248._0_4_ + 0.0;
                                    uVar48 = uVar48 + 1;
                                    iVar51 = *(int *)((long)local_3a8 + lVar84 * 4);
                                    in_XMM3 = local_248;
                                  }
                                  uVar82 = uVar70 & 0xffffffff;
                                  uVar70 = uVar70 + 1;
                                  uVar86 = local_468._16_8_;
                                } while ((long)uVar70 < (long)iVar51);
                              }
                              iVar69 = iVar69 + iVar49;
                              lVar84 = lVar84 + 1;
                              pvVar56 = local_3a8;
                            } while (lVar84 != CONCAT44(uVar128,uVar88));
                            local_3f0 = psVar58;
                            stbtt__sort_edges_quicksort(psVar58,uVar48);
                            if (1 < (int)uVar48) {
                              uVar70 = 1;
                              lVar84 = 2;
                              psVar58 = local_3f0;
                              do {
                                uVar4 = local_3f0[uVar70].x0;
                                uVar5 = local_3f0[uVar70].y0;
                                iVar69 = local_3f0[uVar70].invert;
                                local_238[0].cursor = iVar69;
                                local_238[0].data = *(uchar **)&local_3f0[uVar70].x1;
                                lVar66 = lVar84;
                                psVar83 = psVar58;
                                do {
                                  if (psVar83->y0 <= (float)uVar5) {
                                    uVar88 = (int)lVar66 - 1;
                                    goto LAB_00209afe;
                                  }
                                  psVar83[1].invert = psVar83->invert;
                                  fVar98 = psVar83->y0;
                                  fVar108 = psVar83->x1;
                                  fVar113 = psVar83->y1;
                                  psVar83[1].x0 = psVar83->x0;
                                  psVar83[1].y0 = fVar98;
                                  psVar83[1].x1 = fVar108;
                                  psVar83[1].y1 = fVar113;
                                  lVar66 = lVar66 + -1;
                                  psVar83 = psVar83 + -1;
                                } while (1 < lVar66);
                                uVar88 = 0;
LAB_00209afe:
                                if (uVar70 != uVar88) {
                                  local_3f0[(int)uVar88].x0 = (float)uVar4;
                                  local_3f0[(int)uVar88].y0 = (float)uVar5;
                                  *(uchar **)&local_3f0[(int)uVar88].x1 = local_238[0].data;
                                  local_3f0[(int)uVar88].invert = iVar69;
                                }
                                uVar70 = uVar70 + 1;
                                lVar84 = lVar84 + 1;
                                psVar58 = psVar58 + 1;
                              } while (uVar70 != uVar48);
                            }
                            local_468.next = (stbtt__active_edge *)0x0;
                            scanline = local_238;
                            if (0x40 < (int)uVar72) {
                              scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uVar72 * 8 + 4);
                            }
                            local_3f0[(int)uVar48].y0 = (float)(iVar50 + local_3f4) + 1.0;
                            if ((uint)local_3b8 < 0x7fffffff) {
                              local_2a8 = (long)(int)uVar72;
                              local_310 = (float *)((long)&scanline->data + local_2a8 * 4);
                              local_2f0 = (float)(int)sVar47;
                              local_2d8 = local_310 + 1;
                              local_298 = local_2a8 * 4;
                              local_2a0 = (long)((int)local_3e8 + 2) << 2;
                              local_3f8 = (float)(int)uVar72;
                              local_340 = 0;
                              psVar62 = (stbtt__active_edge *)0x0;
                              local_338 = 0;
                              local_370 = (undefined8 *)0x0;
                              local_3fc = 0;
                              local_3b0 = (stbtt__active_edge *)0x0;
                              psVar58 = local_3f0;
                              iVar69 = local_3f4;
                              iVar49 = local_3f4;
                              do {
                                local_304 = iVar49;
                                fVar98 = (float)local_304;
                                fVar108 = fVar98 + 1.0;
                                memset(scanline,0,local_298);
                                memset(local_310,0,local_2a0);
                                if (psVar62 != (stbtt__active_edge *)0x0) {
                                  psVar60 = &local_468;
                                  do {
                                    if (psVar62->ey <= fVar98) {
                                      psVar60->next = psVar62->next;
                                      psVar62->direction = 0.0;
                                      psVar62->next = local_3b0;
                                      local_3b0 = psVar62;
                                      psVar62 = psVar60;
                                    }
                                    ppsVar37 = &psVar62->next;
                                    psVar60 = psVar62;
                                    psVar62 = *ppsVar37;
                                  } while (*ppsVar37 != (stbtt__active_edge *)0x0);
                                }
                                fVar113 = psVar58->y0;
                                psVar62 = local_3b0;
                                if (fVar113 <= fVar108) {
                                  bVar90 = (int)local_338 == 0;
                                  do {
                                    fVar114 = psVar58->y1;
                                    if ((fVar113 != fVar114) || (NAN(fVar113) || NAN(fVar114))) {
                                      if (psVar62 == (stbtt__active_edge *)0x0) {
                                        if (local_3fc == 0) {
                                          puVar61 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar61 == (undefined8 *)0x0) {
                                            psVar62 = (stbtt__active_edge *)0x0;
                                            local_3fc = 0;
                                            goto LAB_0020a4e9;
                                          }
                                          *puVar61 = local_370;
                                          fVar113 = psVar58->y0;
                                          fVar114 = psVar58->y1;
                                          local_370 = puVar61;
                                          local_3fc = 799;
                                        }
                                        else {
                                          local_3fc = local_3fc + -1;
                                        }
                                        psVar62 = (stbtt__active_edge *)
                                                  (local_370 + (long)local_3fc * 4 + 1);
                                        psVar60 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        psVar60 = psVar62->next;
                                      }
                                      fVar113 = (psVar58->x1 - psVar58->x0) / (fVar114 - fVar113);
                                      psVar62->fdx = fVar113;
                                      psVar62->fdy = (float)(-(uint)(fVar113 != 0.0) &
                                                            (uint)(1.0 / fVar113));
                                      psVar62->fx = ((fVar98 - psVar58->y0) * fVar113 + psVar58->x0)
                                                    - local_2f0;
                                      psVar62->direction =
                                           *(float *)(&DAT_0025cc10 +
                                                     (ulong)(psVar58->invert == 0) * 4);
                                      psVar62->sy = psVar58->y0;
                                      fVar113 = psVar58->y1;
                                      psVar62->ey = fVar113;
                                      psVar62->next = (stbtt__active_edge *)0x0;
                                      if (fVar113 < fVar98 && (bVar90 && iVar69 != 0)) {
                                        psVar62->ey = fVar98;
                                      }
                                      psVar62->next = local_468.next;
                                      local_468.next = psVar62;
                                      psVar62 = psVar60;
                                    }
LAB_0020a4e9:
                                    fVar113 = psVar58[1].y0;
                                    psVar58 = psVar58 + 1;
                                  } while (fVar113 <= fVar108);
                                }
                                local_3b0 = psVar62;
                                psVar62 = local_468.next;
                                pvVar52 = local_3a8;
                                for (psVar60 = local_468.next; local_468.next = psVar62,
                                    local_3a8 = pvVar52, psVar60 != (stbtt__active_edge *)0x0;
                                    psVar60 = psVar60->next) {
                                  fVar113 = psVar60->fx;
                                  fVar114 = psVar60->fdx;
                                  if ((fVar114 != 0.0) || (NAN(fVar114))) {
                                    fVar122 = fVar114 + fVar113;
                                    fVar115 = psVar60->sy;
                                    fVar116 = (float)(~-(uint)(fVar98 < fVar115) & (uint)fVar113 |
                                                     (uint)((fVar115 - fVar98) * fVar114 + fVar113)
                                                     & -(uint)(fVar98 < fVar115));
                                    if (0.0 <= fVar116) {
                                      fVar124 = psVar60->ey;
                                      fVar126 = (float)(-(uint)(fVar124 < fVar108) &
                                                        (uint)((fVar124 - fVar98) * fVar114 +
                                                              fVar113) |
                                                       ~-(uint)(fVar124 < fVar108) & (uint)fVar122);
                                      if (((0.0 <= fVar126) && (fVar116 < local_3f8)) &&
                                         (fVar126 < local_3f8)) {
                                        if (fVar115 <= fVar98) {
                                          fVar115 = fVar98;
                                        }
                                        uVar48 = (uint)fVar116;
                                        if (fVar108 <= fVar124) {
                                          fVar124 = fVar108;
                                        }
                                        uVar88 = (uint)fVar126;
                                        if (uVar48 == uVar88) {
                                          fVar138 = (fVar124 - fVar115) * psVar60->direction;
                                          lVar84 = (long)(int)uVar48;
                                          *(float *)((long)&scanline->data + lVar84 * 4) =
                                               ((((float)(int)uVar48 + 1.0) - fVar126) +
                                               (((float)(int)uVar48 + 1.0) - fVar116)) * 0.5 *
                                               fVar138 + *(float *)((long)&scanline->data +
                                                                   lVar84 * 4);
                                        }
                                        else {
                                          fVar114 = psVar60->fdy;
                                          uVar73 = uVar48;
                                          fVar127 = fVar126;
                                          if (fVar126 < fVar116) {
                                            fVar113 = fVar98 - fVar115;
                                            fVar115 = (fVar98 - fVar124) + fVar108;
                                            fVar114 = -fVar114;
                                            fVar124 = fVar113 + fVar108;
                                            uVar73 = uVar88;
                                            uVar88 = uVar48;
                                            fVar113 = fVar122;
                                            fVar127 = fVar116;
                                            fVar116 = fVar126;
                                          }
                                          iVar69 = uVar73 + 1;
                                          fVar136 = (float)(int)uVar88;
                                          fVar126 = ((float)iVar69 - fVar113) * fVar114 + fVar98;
                                          fVar122 = fVar108;
                                          if (fVar126 <= fVar108) {
                                            fVar122 = fVar126;
                                          }
                                          fVar138 = psVar60->direction;
                                          fVar126 = (fVar122 - fVar115) * fVar138;
                                          fVar113 = (fVar136 - fVar113) * fVar114 + fVar98;
                                          *(float *)((long)&scanline->data + (long)(int)uVar73 * 4)
                                               = ((float)iVar69 - fVar116) * fVar126 * 0.5 +
                                                 *(float *)((long)&scanline->data +
                                                           (long)(int)uVar73 * 4);
                                          if ((fVar108 < fVar113) &&
                                             (fVar113 = fVar108, uVar88 - iVar69 != 0)) {
                                            fVar114 = (fVar108 - fVar122) /
                                                      (float)(int)(uVar88 - iVar69);
                                          }
                                          if (iVar69 < (int)uVar88) {
                                            lVar84 = 0;
                                            do {
                                              *(float *)((long)&scanline->data +
                                                        (iVar69 + lVar84) * 4) =
                                                   fVar114 * fVar138 * 0.5 + fVar126 +
                                                   *(float *)((long)&scanline->data +
                                                             (iVar69 + lVar84) * 4);
                                              fVar126 = fVar126 + fVar114 * fVar138;
                                              lVar84 = lVar84 + 1;
                                            } while (~uVar73 + uVar88 != (int)lVar84);
                                          }
                                          lVar84 = (long)(int)uVar88;
                                          *(float *)((long)&scanline->data + lVar84 * 4) =
                                               (((fVar136 + 1.0) - fVar127) +
                                               ((fVar136 + 1.0) - fVar136)) * 0.5 *
                                               (fVar124 - fVar113) * fVar138 + fVar126 +
                                               *(float *)((long)&scanline->data + lVar84 * 4);
                                          fVar138 = (fVar124 - fVar115) * fVar138;
                                        }
                                        local_2d8[lVar84] = fVar138 + local_2d8[lVar84];
                                        goto LAB_0020a28b;
                                      }
                                    }
                                    if ((uint)local_3e8 < 0x7fffffff) {
                                      local_368 = (ImFontConfig *)(ulong)(uint)fVar113;
                                      uStack_360 = 0;
                                      uStack_35c = 0;
                                      local_468.ey = (float)((ulong)local_468._24_8_ >> 0x20);
                                      local_468.sy = fVar114;
                                      uVar48 = 0;
                                      fVar115 = fVar98;
                                      local_448 = ZEXT416((uint)fVar122);
                                      do {
                                        fVar122 = (float)(int)uVar48;
                                        uVar88 = uVar48 + 1;
                                        fVar124 = (float)(int)uVar88;
                                        fVar116 = (fVar122 - fVar113) / fVar114 + fVar115;
                                        fVar114 = (fVar124 - fVar113) / fVar114 + fVar115;
                                        fVar126 = local_448._0_4_;
                                        fVar98 = fVar115;
                                        if ((fVar122 <= fVar113) || (fVar126 <= fVar124)) {
                                          if ((fVar122 <= fVar126) || (fVar113 <= fVar124)) {
                                            if (((fVar122 <= fVar113) || (fVar126 <= fVar122)) &&
                                               ((fVar122 <= fVar126 || (fVar113 <= fVar122)))) {
                                              if (((fVar113 < fVar124) && (fVar124 < fVar126)) ||
                                                 ((fVar122 = fVar113, fVar116 = fVar115,
                                                  fVar126 < fVar124 && (fVar124 < fVar113))))
                                              goto LAB_00209f41;
                                              goto LAB_00209fef;
                                            }
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar48,psVar60,fVar113,
                                                       fVar115,fVar124,fVar114);
                                            fVar113 = fVar124;
                                            fVar115 = fVar114;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar48,psVar60,fVar113,
                                                     fVar115,fVar122,fVar116);
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar48,psVar60,fVar113,
                                                     fVar115,fVar122,fVar116);
                                          fVar113 = fVar122;
                                          fVar115 = fVar116;
LAB_00209f41:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar48,psVar60,fVar113,
                                                     fVar115,fVar124,fVar114);
                                          fVar122 = fVar124;
                                          fVar116 = fVar114;
                                        }
LAB_00209fef:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar48,psVar60,fVar122,fVar116,
                                                   local_448._0_4_,fVar108);
                                        uVar48 = uVar88;
                                        fVar113 = local_368._0_4_;
                                        fVar115 = fVar98;
                                        fVar114 = local_468.sy;
                                      } while (uVar72 != uVar88);
                                    }
                                  }
                                  else if (fVar113 < local_3f8) {
                                    if (0.0 <= fVar113) {
                                      local_368 = (ImFontConfig *)(ulong)(uint)fVar113;
                                      uStack_360 = 0;
                                      uStack_35c = 0;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar113,psVar60,fVar113,
                                                 fVar98,fVar113,fVar108);
                                      iVar69 = (int)fVar113 + 1;
                                      fVar113 = local_368._0_4_;
                                    }
                                    else {
                                      iVar69 = 0;
                                    }
                                    stbtt__handle_clipped_edge
                                              (local_310,iVar69,psVar60,fVar113,fVar98,fVar113,
                                               fVar108);
                                  }
LAB_0020a28b:
                                  uVar86 = local_468._16_8_;
                                  psVar62 = local_468.next;
                                  pvVar52 = local_3a8;
                                  iVar69 = local_3f4;
                                }
                                in_XMM3._0_12_ = ZEXT812(0x437f0000);
                                in_XMM3._12_4_ = 0;
                                if ((uint)local_3e8 < 0x7fffffff) {
                                  fVar98 = 0.0;
                                  psVar59 = scanline;
                                  uVar70 = local_340;
                                  lVar84 = local_2a8;
                                  do {
                                    fVar98 = fVar98 + *(float *)((long)&psVar59->data +
                                                                local_2a8 * 4);
                                    iVar49 = (int)(ABS(*(float *)&psVar59->data + fVar98) * 255.0 +
                                                  0.5);
                                    uVar75 = (uchar)iVar49;
                                    if (0xfe < iVar49) {
                                      uVar75 = 0xff;
                                    }
                                    local_290[(int)uVar70] = uVar75;
                                    uVar70 = (ulong)((int)uVar70 + 1);
                                    psVar59 = (stbtt__buf *)((long)&psVar59->data + 4);
                                    lVar84 = lVar84 + -1;
                                  } while (lVar84 != 0);
                                }
                                if (psVar62 != (stbtt__active_edge *)0x0) {
                                  psVar60 = &local_468;
                                  psVar67 = psVar62;
                                  do {
                                    psVar67->fx = psVar67->fdx + psVar67->fx;
                                    psVar60 = psVar60->next;
                                    psVar67 = psVar60->next;
                                  } while (psVar67 != (stbtt__active_edge *)0x0);
                                }
                                iVar50 = (int)local_338;
                                local_338 = (ulong)(iVar50 + 1);
                                local_340 = (ulong)(uint)((int)local_340 + (int)local_468.fdx);
                                iVar49 = local_304 + 1;
                                puVar61 = local_370;
                              } while (iVar50 != (uint)local_3b8);
                              while (puVar61 != (undefined8 *)0x0) {
                                puVar15 = (undefined8 *)*puVar61;
                                ImGui::MemFree(puVar61);
                                puVar61 = puVar15;
                              }
                            }
                            psVar58 = local_3f0;
                            if (scanline != local_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(psVar58);
                            pvVar56 = pvVar52;
                          }
                          ImGui::MemFree(pvVar56);
                          ImGui::MemFree((void *)local_428._0_8_);
                        }
                      }
                    }
                  }
                }
LAB_0020a591:
                ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
                iVar69 = *(int *)(local_318 + 0xc);
                auVar99 = _DAT_0024c080;
                if (1 < (byte)local_3e0) {
                  iVar49 = *(int *)(local_318 + 4);
                  iVar50 = *(int *)(local_318 + 8);
                  local_238[0].data = (uchar *)0x0;
                  if (0 < iVar50) {
                    puVar55 = local_348 + *(int *)(local_318 + 0x10) * lVar74 + (long)iVar69;
                    iVar69 = iVar49 - (int)local_3e0;
                    uVar48 = iVar69 + 1;
                    uVar86 = (ulong)uVar48;
                    iVar51 = 0;
                    do {
                      uVar70 = local_3e0;
                      __memset_chk(local_238,0,local_3e0);
                      auVar99 = _DAT_0024c080;
                      uVar72 = uVar48;
                      switch((int)uVar70) {
                      case 2:
                        if (iVar69 < 0) {
LAB_0020a827:
                          uVar70 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar82 = 0;
                          uVar70 = 0;
                          do {
                            bVar6 = puVar55[uVar82];
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 + 2 & 7)) =
                                 bVar6;
                            uVar88 = (int)uVar70 + ((uint)bVar6 - (uint)bVar7);
                            uVar70 = (ulong)uVar88;
                            puVar55[uVar82] = (uchar)(uVar88 >> 1);
                            uVar82 = uVar82 + 1;
                          } while (uVar86 != uVar82);
                        }
                        break;
                      case 3:
                        if (iVar69 < 0) goto LAB_0020a827;
                        uVar82 = 0;
                        uVar70 = 0;
                        do {
                          bVar6 = puVar55[uVar82];
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 + 3 & 7)) =
                               bVar6;
                          uVar70 = (ulong)((int)uVar70 + ((uint)bVar6 - (uint)bVar7));
                          puVar55[uVar82] = (uchar)(uVar70 / 3);
                          uVar82 = uVar82 + 1;
                        } while (uVar86 != uVar82);
                        break;
                      case 4:
                        if (iVar69 < 0) goto LAB_0020a827;
                        uVar82 = 0;
                        uVar70 = 0;
                        do {
                          bVar6 = puVar55[uVar82];
                          uVar77 = (ulong)((uint)uVar82 & 7);
                          bVar7 = *(byte *)((long)&local_238[0].data + uVar77);
                          *(byte *)((long)&local_238[0].data + (uVar77 ^ 4)) = bVar6;
                          uVar88 = (int)uVar70 + ((uint)bVar6 - (uint)bVar7);
                          uVar70 = (ulong)uVar88;
                          puVar55[uVar82] = (uchar)(uVar88 >> 2);
                          uVar82 = uVar82 + 1;
                        } while (uVar86 != uVar82);
                        break;
                      case 5:
                        if (iVar69 < 0) goto LAB_0020a827;
                        uVar82 = 0;
                        uVar70 = 0;
                        do {
                          bVar6 = puVar55[uVar82];
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 + 5 & 7)) =
                               bVar6;
                          uVar70 = (ulong)((int)uVar70 + ((uint)bVar6 - (uint)bVar7));
                          puVar55[uVar82] = (uchar)(uVar70 / 5);
                          uVar82 = uVar82 + 1;
                        } while (uVar86 != uVar82);
                        break;
                      default:
                        if (iVar69 < 0) {
                          uVar70 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar82 = 0;
                          uVar70 = 0;
                          do {
                            bVar6 = puVar55[uVar82];
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar82 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_278 + (uint)uVar82 & 7)) = bVar6;
                            uVar70 = (ulong)((int)uVar70 + ((uint)bVar6 - (uint)bVar7));
                            puVar55[uVar82] = (uchar)(uVar70 / (local_3e0 & 0xffffffff));
                            uVar82 = uVar82 + 1;
                          } while (uVar86 != uVar82);
                        }
                      }
                      if ((int)uVar72 < iVar49) {
                        uVar82 = (ulong)uVar72;
                        do {
                          uVar70 = (ulong)((int)uVar70 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)uVar82 & 7)));
                          puVar55[uVar82] = (uchar)(uVar70 / (local_3e0 & 0xffffffff));
                          uVar82 = uVar82 + 1;
                        } while ((int)uVar82 < iVar49);
                      }
                      puVar55 = puVar55 + lVar74;
                      iVar51 = iVar51 + 1;
                    } while (iVar51 != iVar50);
                    iVar69 = *(int *)(local_318 + 0xc);
                    uVar86 = local_468._16_8_;
                  }
                }
                if (1 < (byte)uVar86) {
                  iVar49 = *(int *)(local_318 + 4);
                  iVar50 = *(int *)(local_318 + 8);
                  local_238[0].data = (uchar *)0x0;
                  if (0 < iVar49) {
                    pbVar87 = local_348 + *(int *)(local_318 + 0x10) * lVar74 + (long)iVar69;
                    iVar69 = iVar50 - (int)uVar86;
                    uVar48 = iVar69 + 1;
                    uVar70 = (ulong)uVar48;
                    iVar51 = 0;
                    do {
                      __memset_chk(local_238,0,uVar86);
                      auVar99 = _DAT_0024c080;
                      uVar72 = uVar48;
                      switch((int)uVar86) {
                      case 2:
                        if (iVar69 < 0) {
LAB_0020aba8:
                          uVar82 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar77 = 0;
                          uVar82 = 0;
                          pbVar81 = pbVar87;
                          do {
                            bVar6 = *pbVar81;
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 + 2 & 7)) =
                                 bVar6;
                            uVar88 = (int)uVar82 + ((uint)bVar6 - (uint)bVar7);
                            uVar82 = (ulong)uVar88;
                            *pbVar81 = (byte)(uVar88 >> 1);
                            uVar77 = uVar77 + 1;
                            pbVar81 = pbVar81 + lVar74;
                          } while (uVar70 != uVar77);
                        }
                        break;
                      case 3:
                        if (iVar69 < 0) goto LAB_0020aba8;
                        uVar77 = 0;
                        uVar82 = 0;
                        pbVar81 = pbVar87;
                        do {
                          bVar6 = *pbVar81;
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 + 3 & 7)) =
                               bVar6;
                          uVar82 = (ulong)((int)uVar82 + ((uint)bVar6 - (uint)bVar7));
                          *pbVar81 = (byte)(uVar82 / 3);
                          uVar77 = uVar77 + 1;
                          pbVar81 = pbVar81 + lVar74;
                        } while (uVar70 != uVar77);
                        break;
                      case 4:
                        if (iVar69 < 0) goto LAB_0020aba8;
                        uVar77 = 0;
                        uVar82 = 0;
                        pbVar81 = pbVar87;
                        do {
                          bVar6 = *pbVar81;
                          uVar80 = (ulong)((uint)uVar77 & 7);
                          bVar7 = *(byte *)((long)&local_238[0].data + uVar80);
                          *(byte *)((long)&local_238[0].data + (uVar80 ^ 4)) = bVar6;
                          uVar88 = (int)uVar82 + ((uint)bVar6 - (uint)bVar7);
                          uVar82 = (ulong)uVar88;
                          *pbVar81 = (byte)(uVar88 >> 2);
                          uVar77 = uVar77 + 1;
                          pbVar81 = pbVar81 + lVar74;
                        } while (uVar70 != uVar77);
                        break;
                      case 5:
                        if (iVar69 < 0) goto LAB_0020aba8;
                        uVar77 = 0;
                        uVar82 = 0;
                        pbVar81 = pbVar87;
                        do {
                          bVar6 = *pbVar81;
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 + 5 & 7)) =
                               bVar6;
                          uVar82 = (ulong)((int)uVar82 + ((uint)bVar6 - (uint)bVar7));
                          *pbVar81 = (byte)(uVar82 / 5);
                          uVar77 = uVar77 + 1;
                          pbVar81 = pbVar81 + lVar74;
                        } while (uVar70 != uVar77);
                        break;
                      default:
                        if (iVar69 < 0) {
                          uVar82 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar77 = 0;
                          uVar82 = 0;
                          pbVar81 = pbVar87;
                          do {
                            bVar6 = *pbVar81;
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar77 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_280 + (uint)uVar77 & 7)) = bVar6;
                            uVar82 = (ulong)((int)uVar82 + ((uint)bVar6 - (uint)bVar7));
                            *pbVar81 = (byte)(uVar82 / (uVar86 & 0xffffffff));
                            uVar77 = uVar77 + 1;
                            pbVar81 = pbVar81 + lVar74;
                          } while (uVar70 != uVar77);
                        }
                      }
                      if ((int)uVar72 < iVar50) {
                        lVar84 = (long)(int)uVar72;
                        pbVar81 = pbVar87 + lVar74 * lVar84;
                        do {
                          uVar82 = (ulong)((int)uVar82 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)lVar84 & 7)));
                          *pbVar81 = (byte)(uVar82 / (uVar86 & 0xffffffff));
                          lVar84 = lVar84 + 1;
                          pbVar81 = pbVar81 + lVar74;
                        } while (iVar50 != lVar84);
                      }
                      pbVar87 = pbVar87 + 1;
                      iVar51 = iVar51 + 1;
                    } while (iVar51 != iVar49);
                    iVar69 = *(int *)(local_318 + 0xc);
                  }
                }
                *local_288 = (short)iVar69;
                local_288[1] = *(undefined2 *)(local_318 + 0x10);
                local_288[2] = (short)*(undefined4 *)(local_318 + 4) +
                               (short)*(undefined4 *)(local_318 + 0xc);
                local_288[3] = (short)*(undefined4 *)(local_318 + 8) +
                               (short)*(undefined4 *)(local_318 + 0x10);
                *(float *)(local_288 + 8) =
                     (float)(int)(short)((short)(local_2f4 << 8) + (short)local_2f8) * local_2c8;
                *(float *)(local_288 + 4) = (float)local_38c * local_2fc + local_39c;
                *(float *)(local_288 + 6) = (float)local_390 * local_300 + local_398;
                *(float *)(local_288 + 10) =
                     (float)(*(int *)(local_318 + 4) + local_38c) * local_2fc + local_39c;
                *(float *)(local_288 + 0xc) =
                     (float)(*(int *)(local_318 + 8) + local_390) * local_300 + local_398;
                uVar82 = (ulong)local_400;
                lVar84 = local_330;
                uVar70 = local_320;
                psVar89 = local_328;
                if ((int)local_2d0 == 0) {
                  uVar82 = local_320 & 0xffffffff;
                }
              }
            }
            uVar70 = uVar70 + 1;
          } while ((long)uVar70 < (long)psVar89[1].fontstart);
        }
        fVar98 = local_2b0[local_2e0].RasterizerMultiply;
        if ((fVar98 != 1.0) || (NAN(fVar98))) {
          lVar84 = 0;
          auVar100 = _DAT_0025cad0;
          auVar105 = _DAT_0025cac0;
          in_XMM3 = _DAT_0025cab0;
          auVar107 = _DAT_0025caa0;
          do {
            auVar119 = auVar105 & _DAT_0025cae0 | _DAT_0025caf0;
            uVar48 = auVar105._4_4_;
            uVar72 = auVar105._8_4_;
            uVar88 = auVar105._12_4_;
            auVar109 = auVar100 & _DAT_0025cae0 | _DAT_0025caf0;
            uVar73 = auVar100._4_4_;
            uVar123 = auVar100._8_4_;
            uVar125 = auVar100._12_4_;
            auVar142 = auVar107 & _DAT_0025cae0 | _DAT_0025caf0;
            uVar135 = auVar107._4_4_;
            uVar137 = auVar107._8_4_;
            uVar139 = auVar107._12_4_;
            auVar91 = in_XMM3 & _DAT_0025cae0 | _DAT_0025caf0;
            uVar146 = in_XMM3._4_4_;
            uVar148 = in_XMM3._8_4_;
            uVar150 = in_XMM3._12_4_;
            fVar141 = (((float)(in_XMM3._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar91._0_4_)
                      * fVar98;
            fVar147 = (((float)(uVar146 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar91._4_4_) *
                      fVar98;
            fVar149 = (((float)(uVar148 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar91._8_4_) *
                      fVar98;
            fVar151 = (((float)(uVar150 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar91._12_4_) *
                      fVar98;
            fVar127 = (((float)(auVar107._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar142._0_4_) * fVar98;
            fVar136 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar142._4_4_) *
                      fVar98;
            fVar138 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar142._8_4_) *
                      fVar98;
            fVar140 = (((float)(uVar139 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar142._12_4_) *
                      fVar98;
            fVar116 = (((float)(auVar100._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar109._0_4_) * fVar98;
            fVar122 = (((float)(uVar73 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar109._4_4_) *
                      fVar98;
            fVar124 = (((float)(uVar123 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar109._8_4_) *
                      fVar98;
            fVar126 = (((float)(uVar125 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar109._12_4_) *
                      fVar98;
            fVar108 = (((float)(auVar105._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar119._0_4_) * fVar98;
            fVar113 = (((float)(uVar48 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar119._4_4_) *
                      fVar98;
            fVar114 = (((float)(uVar72 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar119._8_4_) *
                      fVar98;
            fVar115 = (((float)(uVar88 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar119._12_4_) *
                      fVar98;
            auVar112._0_4_ = (int)fVar108;
            auVar112._4_4_ = (int)fVar113;
            auVar112._8_4_ = (int)fVar114;
            auVar112._12_4_ = (int)fVar115;
            auVar162._0_4_ = auVar112._0_4_ >> 0x1f;
            auVar162._4_4_ = auVar112._4_4_ >> 0x1f;
            auVar162._8_4_ = auVar112._8_4_ >> 0x1f;
            auVar162._12_4_ = auVar112._12_4_ >> 0x1f;
            auVar111._0_4_ = (int)(fVar108 - 2.1474836e+09);
            auVar111._4_4_ = (int)(fVar113 - 2.1474836e+09);
            auVar111._8_4_ = (int)(fVar114 - 2.1474836e+09);
            auVar111._12_4_ = (int)(fVar115 - 2.1474836e+09);
            auVar112 = auVar111 & auVar162 | auVar112;
            auVar121._0_4_ = (int)fVar116;
            auVar121._4_4_ = (int)fVar122;
            auVar121._8_4_ = (int)fVar124;
            auVar121._12_4_ = (int)fVar126;
            auVar163._0_4_ = auVar121._0_4_ >> 0x1f;
            auVar163._4_4_ = auVar121._4_4_ >> 0x1f;
            auVar163._8_4_ = auVar121._8_4_ >> 0x1f;
            auVar163._12_4_ = auVar121._12_4_ >> 0x1f;
            auVar120._0_4_ = (int)(fVar116 - 2.1474836e+09);
            auVar120._4_4_ = (int)(fVar122 - 2.1474836e+09);
            auVar120._8_4_ = (int)(fVar124 - 2.1474836e+09);
            auVar120._12_4_ = (int)(fVar126 - 2.1474836e+09);
            auVar121 = auVar120 & auVar163 | auVar121;
            auVar158._0_4_ = (int)fVar127;
            auVar158._4_4_ = (int)fVar136;
            auVar158._8_4_ = (int)fVar138;
            auVar158._12_4_ = (int)fVar140;
            auVar166._0_4_ = auVar158._0_4_ >> 0x1f;
            auVar166._4_4_ = auVar158._4_4_ >> 0x1f;
            auVar166._8_4_ = auVar158._8_4_ >> 0x1f;
            auVar166._12_4_ = auVar158._12_4_ >> 0x1f;
            auVar157._0_4_ = (int)(fVar127 - 2.1474836e+09);
            auVar157._4_4_ = (int)(fVar136 - 2.1474836e+09);
            auVar157._8_4_ = (int)(fVar138 - 2.1474836e+09);
            auVar157._12_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar158 = auVar157 & auVar166 | auVar158;
            auVar144._0_4_ = (int)fVar141;
            auVar144._4_4_ = (int)fVar147;
            auVar144._8_4_ = (int)fVar149;
            auVar144._12_4_ = (int)fVar151;
            auVar164._0_4_ = auVar144._0_4_ >> 0x1f;
            auVar164._4_4_ = auVar144._4_4_ >> 0x1f;
            auVar164._8_4_ = auVar144._8_4_ >> 0x1f;
            auVar164._12_4_ = auVar144._12_4_ >> 0x1f;
            auVar143._0_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar143._4_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar143._8_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar143._12_4_ = (int)(fVar151 - 2.1474836e+09);
            auVar144 = auVar143 & auVar164 | auVar144;
            auVar119 = auVar144 ^ auVar99;
            auVar133._0_4_ = -(uint)(auVar119._0_4_ < -0x7fffff01);
            auVar133._4_4_ = -(uint)(auVar119._4_4_ < -0x7fffff01);
            auVar133._8_4_ = -(uint)(auVar119._8_4_ < -0x7fffff01);
            auVar133._12_4_ = -(uint)(auVar119._12_4_ < -0x7fffff01);
            auVar119 = ~auVar133 & _DAT_0025cb40 | auVar144 & auVar133;
            auVar109 = auVar158 ^ auVar99;
            auVar165._0_4_ = -(uint)(auVar109._0_4_ < -0x7fffff01);
            auVar165._4_4_ = -(uint)(auVar109._4_4_ < -0x7fffff01);
            auVar165._8_4_ = -(uint)(auVar109._8_4_ < -0x7fffff01);
            auVar165._12_4_ = -(uint)(auVar109._12_4_ < -0x7fffff01);
            auVar109 = ~auVar165 & _DAT_0025cb40 | auVar158 & auVar165;
            sVar39 = auVar119._0_2_;
            cVar16 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[0] - (0xff < sVar39);
            sVar39 = auVar119._2_2_;
            sVar40 = CONCAT11((0 < sVar39) * (sVar39 < 0x100) * auVar119[2] - (0xff < sVar39),cVar16
                             );
            sVar39 = auVar119._4_2_;
            cVar17 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[4] - (0xff < sVar39);
            sVar39 = auVar119._6_2_;
            uVar128 = CONCAT13((0 < sVar39) * (sVar39 < 0x100) * auVar119[6] - (0xff < sVar39),
                               CONCAT12(cVar17,sVar40));
            sVar39 = auVar119._8_2_;
            cVar18 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[8] - (0xff < sVar39);
            sVar39 = auVar119._10_2_;
            uVar129 = CONCAT15((0 < sVar39) * (sVar39 < 0x100) * auVar119[10] - (0xff < sVar39),
                               CONCAT14(cVar18,uVar128));
            sVar39 = auVar119._12_2_;
            cVar19 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[0xc] - (0xff < sVar39);
            sVar39 = auVar119._14_2_;
            uVar130 = CONCAT17((0 < sVar39) * (sVar39 < 0x100) * auVar119[0xe] - (0xff < sVar39),
                               CONCAT16(cVar19,uVar129));
            sVar39 = auVar109._0_2_;
            cVar20 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[0] - (0xff < sVar39);
            sVar39 = auVar109._2_2_;
            auVar131._0_10_ =
                 CONCAT19((0 < sVar39) * (sVar39 < 0x100) * auVar109[2] - (0xff < sVar39),
                          CONCAT18(cVar20,uVar130));
            sVar39 = auVar109._4_2_;
            cVar21 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[4] - (0xff < sVar39);
            auVar131[10] = cVar21;
            sVar39 = auVar109._6_2_;
            auVar131[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar109[6] - (0xff < sVar39);
            sVar39 = auVar109._8_2_;
            cVar22 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[8] - (0xff < sVar39);
            auVar132[0xc] = cVar22;
            auVar132._0_12_ = auVar131;
            sVar39 = auVar109._10_2_;
            auVar132[0xd] = (0 < sVar39) * (sVar39 < 0x100) * auVar109[10] - (0xff < sVar39);
            sVar39 = auVar109._12_2_;
            cVar23 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[0xc] - (0xff < sVar39);
            auVar134[0xe] = cVar23;
            auVar134._0_14_ = auVar132;
            sVar39 = auVar109._14_2_;
            auVar134[0xf] = (0 < sVar39) * (sVar39 < 0x100) * auVar109[0xe] - (0xff < sVar39);
            auVar119 = auVar121 ^ auVar99;
            auVar159._0_4_ = -(uint)(auVar119._0_4_ < -0x7fffff01);
            auVar159._4_4_ = -(uint)(auVar119._4_4_ < -0x7fffff01);
            auVar159._8_4_ = -(uint)(auVar119._8_4_ < -0x7fffff01);
            auVar159._12_4_ = -(uint)(auVar119._12_4_ < -0x7fffff01);
            auVar109 = ~auVar159 & _DAT_0025cb40 | auVar121 & auVar159;
            auVar119 = auVar112 ^ auVar99;
            auVar145._0_4_ = -(uint)(auVar119._0_4_ < -0x7fffff01);
            auVar145._4_4_ = -(uint)(auVar119._4_4_ < -0x7fffff01);
            auVar145._8_4_ = -(uint)(auVar119._8_4_ < -0x7fffff01);
            auVar145._12_4_ = -(uint)(auVar119._12_4_ < -0x7fffff01);
            auVar119 = ~auVar145 & _DAT_0025cb40 | auVar112 & auVar145;
            sVar39 = auVar109._0_2_;
            cVar24 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[0] - (0xff < sVar39);
            sVar39 = auVar109._2_2_;
            sVar96 = CONCAT11((0 < sVar39) * (sVar39 < 0x100) * auVar109[2] - (0xff < sVar39),cVar24
                             );
            sVar39 = auVar109._4_2_;
            cVar25 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[4] - (0xff < sVar39);
            sVar39 = auVar109._6_2_;
            uVar152 = CONCAT13((0 < sVar39) * (sVar39 < 0x100) * auVar109[6] - (0xff < sVar39),
                               CONCAT12(cVar25,sVar96));
            sVar39 = auVar109._8_2_;
            cVar26 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[8] - (0xff < sVar39);
            sVar39 = auVar109._10_2_;
            uVar153 = CONCAT15((0 < sVar39) * (sVar39 < 0x100) * auVar109[10] - (0xff < sVar39),
                               CONCAT14(cVar26,uVar152));
            sVar39 = auVar109._12_2_;
            cVar27 = (0 < sVar39) * (sVar39 < 0x100) * auVar109[0xc] - (0xff < sVar39);
            sVar39 = auVar109._14_2_;
            uVar154 = CONCAT17((0 < sVar39) * (sVar39 < 0x100) * auVar109[0xe] - (0xff < sVar39),
                               CONCAT16(cVar27,uVar153));
            sVar39 = auVar119._0_2_;
            cVar28 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[0] - (0xff < sVar39);
            sVar39 = auVar119._2_2_;
            auVar155._0_10_ =
                 CONCAT19((0 < sVar39) * (sVar39 < 0x100) * auVar119[2] - (0xff < sVar39),
                          CONCAT18(cVar28,uVar154));
            sVar39 = auVar119._4_2_;
            cVar29 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[4] - (0xff < sVar39);
            auVar155[10] = cVar29;
            sVar39 = auVar119._6_2_;
            auVar155[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar119[6] - (0xff < sVar39);
            sVar39 = auVar119._8_2_;
            cVar30 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[8] - (0xff < sVar39);
            auVar156[0xc] = cVar30;
            auVar156._0_12_ = auVar155;
            sVar39 = auVar119._10_2_;
            auVar156[0xd] = (0 < sVar39) * (sVar39 < 0x100) * auVar119[10] - (0xff < sVar39);
            sVar39 = auVar119._12_2_;
            cVar31 = (0 < sVar39) * (sVar39 < 0x100) * auVar119[0xc] - (0xff < sVar39);
            auVar160[0xe] = cVar31;
            auVar160._0_14_ = auVar156;
            sVar39 = auVar119._14_2_;
            auVar160[0xf] = (0 < sVar39) * (sVar39 < 0x100) * auVar119[0xe] - (0xff < sVar39);
            sVar39 = (short)((uint)uVar152 >> 0x10);
            auVar161[1] = (0 < sVar39) * (sVar39 < 0x100) * cVar25 - (0xff < sVar39);
            auVar161[0] = (0 < sVar96) * (sVar96 < 0x100) * cVar24 - (0xff < sVar96);
            sVar39 = (short)((uint6)uVar153 >> 0x20);
            auVar161[2] = (0 < sVar39) * (sVar39 < 0x100) * cVar26 - (0xff < sVar39);
            sVar39 = (short)((ulong)uVar154 >> 0x30);
            auVar161[3] = (0 < sVar39) * (sVar39 < 0x100) * cVar27 - (0xff < sVar39);
            sVar39 = (short)((unkuint10)auVar155._0_10_ >> 0x40);
            auVar161[4] = (0 < sVar39) * (sVar39 < 0x100) * cVar28 - (0xff < sVar39);
            sVar39 = auVar155._10_2_;
            auVar161[5] = (0 < sVar39) * (sVar39 < 0x100) * cVar29 - (0xff < sVar39);
            sVar39 = auVar156._12_2_;
            auVar161[6] = (0 < sVar39) * (sVar39 < 0x100) * cVar30 - (0xff < sVar39);
            sVar39 = auVar160._14_2_;
            auVar161[7] = (0 < sVar39) * (sVar39 < 0x100) * cVar31 - (0xff < sVar39);
            auVar161[8] = (0 < sVar40) * (sVar40 < 0x100) * cVar16 - (0xff < sVar40);
            sVar39 = (short)((uint)uVar128 >> 0x10);
            auVar161[9] = (0 < sVar39) * (sVar39 < 0x100) * cVar17 - (0xff < sVar39);
            sVar39 = (short)((uint6)uVar129 >> 0x20);
            auVar161[10] = (0 < sVar39) * (sVar39 < 0x100) * cVar18 - (0xff < sVar39);
            sVar39 = (short)((ulong)uVar130 >> 0x30);
            auVar161[0xb] = (0 < sVar39) * (sVar39 < 0x100) * cVar19 - (0xff < sVar39);
            sVar39 = (short)((unkuint10)auVar131._0_10_ >> 0x40);
            auVar161[0xc] = (0 < sVar39) * (sVar39 < 0x100) * cVar20 - (0xff < sVar39);
            sVar39 = auVar131._10_2_;
            auVar161[0xd] = (0 < sVar39) * (sVar39 < 0x100) * cVar21 - (0xff < sVar39);
            sVar39 = auVar132._12_2_;
            auVar161[0xe] = (0 < sVar39) * (sVar39 < 0x100) * cVar22 - (0xff < sVar39);
            sVar39 = auVar134._14_2_;
            auVar161[0xf] = (0 < sVar39) * (sVar39 < 0x100) * cVar23 - (0xff < sVar39);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar84) = auVar161;
            lVar84 = lVar84 + 0x10;
            iVar69 = (int)DAT_0025cb50;
            auVar100._0_4_ = auVar100._0_4_ + iVar69;
            iVar49 = DAT_0025cb50._4_4_;
            auVar100._4_4_ = uVar73 + iVar49;
            iVar50 = DAT_0025cb50._8_4_;
            auVar100._8_4_ = uVar123 + iVar50;
            iVar51 = DAT_0025cb50._12_4_;
            auVar100._12_4_ = uVar125 + iVar51;
            auVar105._0_4_ = auVar105._0_4_ + iVar69;
            auVar105._4_4_ = uVar48 + iVar49;
            auVar105._8_4_ = uVar72 + iVar50;
            auVar105._12_4_ = uVar88 + iVar51;
            in_XMM3._0_4_ = in_XMM3._0_4_ + iVar69;
            in_XMM3._4_4_ = uVar146 + iVar49;
            in_XMM3._8_4_ = uVar148 + iVar50;
            in_XMM3._12_4_ = uVar150 + iVar51;
            auVar107._0_4_ = auVar107._0_4_ + iVar69;
            auVar107._4_4_ = uVar135 + iVar49;
            auVar107._8_4_ = uVar137 + iVar50;
            auVar107._12_4_ = uVar139 + iVar51;
          } while (lVar84 != 0x100);
          iVar69 = psVar89[1].cff.cursor;
          if (0 < iVar69) {
            lVar66._0_4_ = psVar89[1].hmtx;
            lVar66._4_4_ = psVar89[1].kern;
            iVar49 = 0;
            do {
              if ((*(int *)(lVar66 + 0x14) != 0) && (0 < *(int *)(lVar66 + 8))) {
                iVar69 = *(int *)(lVar66 + 4);
                iVar50 = atlas->TexWidth;
                pbVar87 = atlas->TexPixelsAlpha8 +
                          (long)*(int *)(lVar66 + 0x10) * (long)iVar50 +
                          (long)*(int *)(lVar66 + 0xc);
                iVar51 = *(int *)(lVar66 + 8);
                do {
                  uVar48 = iVar69 + 1;
                  if (0 < iVar69) {
                    do {
                      *pbVar87 = *(byte *)((long)&local_238[0].data + (ulong)*pbVar87);
                      pbVar87 = pbVar87 + 1;
                      uVar48 = uVar48 - 1;
                    } while (1 < uVar48);
                  }
                  pbVar87 = pbVar87 + ((long)iVar50 - (long)iVar69);
                  bVar90 = 1 < iVar51;
                  iVar51 = iVar51 + -1;
                } while (bVar90);
                iVar69 = psVar89[1].cff.cursor;
              }
              iVar49 = iVar49 + 1;
              lVar66 = lVar66 + 0x18;
            } while (iVar49 < iVar69);
          }
        }
        psVar89[1].hmtx = 0;
        psVar89[1].kern = 0;
      }
      lVar84 = local_2e0 + 1;
    } while (lVar84 < (int)local_3c8);
  }
  ImGui::MemFree(local_430);
  ImGui::MemFree(local_2e8);
  pvVar56 = pvStack_3d0;
  if (pvStack_3d0 != (void *)0x0) {
    auVar34._8_8_ = 0;
    auVar34._0_8_ = pvStack_3d0;
    _local_3d8 = (stbtt__buf)(auVar34 << 0x40);
    ImGui::MemFree(pvVar56);
    pvStack_3d0._0_4_ = 0;
    pvStack_3d0._4_4_ = 0;
  }
  iVar69 = (int)local_3c8;
  uVar86 = (ulong)(int)local_3c8;
  if ((long)uVar86 < 1) {
    pvVar56 = pvStack_3c0;
    if (pvStack_3c0 == (void *)0x0) goto LAB_0020b493;
  }
  else {
    uVar70 = 0;
    auVar95._0_12_ = DAT_0025cb70._0_12_;
    auVar95._12_2_ = DAT_0025cb70._6_2_;
    auVar95._14_2_ = DAT_0025cb70._6_2_;
    auVar94._12_4_ = auVar95._12_4_;
    auVar94._0_10_ = (unkbyte10)DAT_0025cb70;
    auVar94._10_2_ = DAT_0025cb70._4_2_;
    auVar93._10_6_ = auVar94._10_6_;
    auVar93._0_8_ = (undefined8)DAT_0025cb70;
    auVar93._8_2_ = DAT_0025cb70._4_2_;
    local_428._8_8_ = auVar93._8_8_;
    local_428._6_2_ = DAT_0025cb70._2_2_;
    local_428._4_2_ = DAT_0025cb70._2_2_;
    local_428._0_2_ = (undefined2)DAT_0025cb70;
    local_428._2_2_ = local_428._0_2_;
    local_448._0_8_ = pvStack_3c0;
    pvVar56 = pvStack_3c0;
    do {
      if (*(int *)((long)pvVar56 + uVar70 * 0x110 + 0xe8) != 0) {
        lVar84 = uVar70 * 0x110 + local_448._0_8_;
        pIVar85 = (atlas->ConfigData).Data;
        pIVar68 = pIVar85 + uVar70;
        pIVar13 = pIVar85[uVar70].DstFont;
        if (pIVar85[uVar70].MergeMode == true) {
          uVar11 = pIVar13->ConfigDataCount;
          sVar39 = uVar11 + 1;
          fVar98 = pIVar13->Ascent;
        }
        else {
          fVar108 = pIVar85[uVar70].SizePixels;
          lVar74 = *(long *)(lVar84 + 8);
          lVar66 = (long)*(int *)(lVar84 + 0x24);
          uVar48 = (uint)*(byte *)(lVar74 + 4 + lVar66);
          bVar6 = *(byte *)(lVar74 + 5 + lVar66);
          bVar7 = *(byte *)(lVar74 + 7 + lVar66);
          bVar8 = *(byte *)(lVar74 + 6 + lVar66);
          ImFont::ClearOutputData(pIVar13);
          iVar49 = (uint)bVar8 * 0x100 + uVar48;
          auVar32._1_9_ = (unkuint9)(byte)((uint)iVar49 >> 0x18) << 8;
          auVar32[0] = (char)((uint)iVar49 >> 0x10);
          auVar32._10_6_ = 0;
          auVar35._1_12_ = SUB1612(auVar32 << 0x28,4);
          auVar35[0] = (char)((uint)iVar49 >> 8);
          auVar35[0xd] = 0;
          auVar36._1_14_ = auVar35 << 8;
          auVar36[0] = (char)iVar49;
          auVar36[0xf] = 0;
          auVar99 = ZEXT416((uint)bVar6 | (uint)bVar7 << 0x10) | auVar36 << 8;
          sVar40 = auVar99._0_2_;
          sVar39 = auVar99._2_2_;
          auVar101._0_4_ = (float)((int)sVar40 - (int)sVar39);
          fVar108 = fVar108 / auVar101._0_4_;
          sVar97 = auVar99._6_2_;
          auVar104._0_14_ = ZEXT414((uint)auVar101._0_4_);
          auVar104._14_2_ = sVar97;
          sVar96 = auVar99._4_2_;
          auVar103._12_4_ = auVar104._12_4_;
          auVar103._4_6_ = 0;
          auVar103._0_4_ = auVar101._0_4_;
          auVar103._10_2_ = sVar96;
          auVar102._10_6_ = auVar103._10_6_;
          auVar102._4_6_ = 0;
          auVar102._0_4_ = auVar101._0_4_;
          auVar101._8_8_ = auVar102._8_8_;
          auVar101._6_2_ = sVar39;
          auVar101._4_2_ = (short)((uint)auVar101._0_4_ >> 0x10);
          auVar106._0_2_ = -(ushort)(sVar40 < (short)local_428._0_2_);
          auVar106._2_2_ = -(ushort)(sVar40 < (short)local_428._2_2_);
          auVar106._4_2_ = -(ushort)(sVar39 < (short)local_428._4_2_);
          auVar106._6_2_ = -(ushort)(sVar39 < (short)local_428._6_2_);
          auVar106._8_2_ = -(ushort)(sVar96 < (short)local_428._8_2_);
          auVar106._10_2_ = -(ushort)(sVar96 < (short)local_428._10_2_);
          auVar106._12_2_ = -(ushort)(sVar97 < (short)local_428._12_2_);
          auVar106._14_2_ = -(ushort)(sVar97 < (short)local_428._14_2_);
          auVar99 = auVar106 & _DAT_002573d0 | ~auVar106 & _DAT_0024c0c0;
          fVar98 = (float)(int)(fVar108 * (float)(int)sVar40 + auVar99._0_4_);
          pIVar13->FontSize = pIVar68->SizePixels;
          pIVar13->ConfigData = pIVar68;
          pIVar13->ContainerAtlas = atlas;
          pIVar13->Ascent = fVar98;
          pIVar13->Descent = (float)(int)(fVar108 * (float)(auVar101._4_4_ >> 0x10) + auVar99._4_4_)
          ;
          sVar39 = 1;
        }
        pIVar13->ConfigDataCount = sVar39;
        if (0 < *(int *)(lVar84 + 0xe8)) {
          fVar108 = (pIVar68->GlyphOffset).x;
          fVar98 = (float)(int)(fVar98 + 0.5) + (pIVar68->GlyphOffset).y;
          lVar74 = 0;
          lVar66 = 0;
          do {
            lVar57 = *(long *)(lVar84 + 0xd0);
            fVar114 = 1.0 / (float)atlas->TexHeight;
            fVar113 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar13,pIVar68,*(ImWchar *)(*(long *)(lVar84 + 0x108) + lVar66 * 4),
                             *(float *)(lVar57 + 8 + lVar74) + 0.0 + fVar108,
                             *(float *)(lVar57 + 0xc + lVar74) + 0.0 + fVar98,
                             *(float *)(lVar57 + 0x14 + lVar74) + 0.0 + fVar108,
                             *(float *)(lVar57 + 0x18 + lVar74) + 0.0 + fVar98,
                             (float)*(ushort *)(lVar57 + lVar74) * fVar113,
                             (float)*(ushort *)(lVar57 + 2 + lVar74) * fVar114,
                             (float)*(ushort *)(lVar57 + 4 + lVar74) * fVar113,
                             (float)*(ushort *)(lVar57 + 6 + lVar74) * fVar114,
                             *(float *)(lVar57 + 0x10 + lVar74));
            lVar66 = lVar66 + 1;
            lVar74 = lVar74 + 0x1c;
          } while (lVar66 < *(int *)(lVar84 + 0xe8));
        }
      }
      uVar70 = uVar70 + 1;
      pvVar56 = (void *)local_448._0_8_;
    } while (uVar70 < uVar86);
    if (0 < iVar69) {
      puVar61 = (undefined8 *)(local_448._0_8_ + 0x108);
      uVar70 = 0;
      do {
        if ((void *)*puVar61 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar61);
        }
        if ((void *)puVar61[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar61[-2]);
        }
        uVar70 = uVar70 + 1;
        puVar61 = puVar61 + 0x22;
      } while (uVar70 < uVar86);
    }
  }
  local_3c8 = 0;
  ImGui::MemFree(pvVar56);
  pvStack_3c0 = (void *)0x0;
LAB_0020b493:
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_350 != (void *)0x0) {
    ImGui::MemFree(pvStack_350);
  }
  bVar90 = true;
  pvVar56 = (void *)0x0;
LAB_0020b4b4:
  if (pvStack_380 != (void *)0x0) {
    ImGui::MemFree(pvStack_380);
  }
  if (pvVar56 != (void *)0x0) {
    ImGui::MemFree(pvVar56);
  }
  return bVar90;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}